

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# job_manager_test.cpp
# Opt level: O2

void __thiscall
JobManagerTestSuite_BuildFinalResultString_Test::TestBody
          (JobManagerTestSuite_BuildFinalResultString_Test *this)

{
  JobManager *this_00;
  element_type *peVar1;
  element_type *peVar2;
  bool bVar3;
  int iVar4;
  CommissionerAppMock *pCVar5;
  TypedExpectation<ot::commissioner::Error_(std::shared_ptr<ot::commissioner::CommissionerApp>_&,_const_ot::commissioner::Config_&)>
  *pTVar6;
  TypedExpectation<bool_()> *pTVar7;
  TypedExpectation<ot::commissioner::Error_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_unsigned_short)>
  *pTVar8;
  reference pvVar9;
  TypedExpectation<ot::commissioner::Error_(unsigned_short_&)> *pTVar10;
  TypedExpectation<ot::commissioner::Error_(ot::commissioner::ActiveOperationalDataset_&,_unsigned_short)>
  *pTVar11;
  TypedExpectation<ot::commissioner::Error_(const_ot::commissioner::SecurityPolicy_&)> *pTVar12;
  json_value *this_01;
  pointer *__ptr;
  char *pcVar13;
  char *pcVar14;
  _func_int **pp_Var15;
  long lVar16;
  pointer pbVar17;
  initializer_list<testing::Action<void_(std::shared_ptr<ot::commissioner::CommissionerApp>_&,_const_ot::commissioner::Config_&)>_>
  __l;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_00;
  initializer_list<unsigned_long> __l_01;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_02;
  initializer_list<unsigned_long> __l_03;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_04;
  initializer_list<unsigned_long> __l_05;
  initializer_list<testing::Action<void_(unsigned_short_&)>_> __l_06;
  initializer_list<testing::Action<void_(unsigned_short_&)>_> __l_07;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_08;
  initializer_list<unsigned_long> __l_09;
  initializer_list<testing::Action<void_(ot::commissioner::ActiveOperationalDataset_&,_unsigned_short)>_>
  __l_10;
  initializer_list<testing::Action<void_(ot::commissioner::ActiveOperationalDataset_&,_unsigned_short)>_>
  __l_11;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_12;
  initializer_list<unsigned_long> __l_13;
  initializer_list<testing::Action<void_(const_ot::commissioner::SecurityPolicy_&)>_> __l_14;
  initializer_list<testing::Action<void_(const_ot::commissioner::SecurityPolicy_&)>_> __l_15;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_16;
  initializer_list<unsigned_long> __l_17;
  Action<void_(ot::commissioner::ActiveOperationalDataset_&)> converted_2;
  Action<void_(unsigned_short_&)> converted;
  allocator local_b3d;
  allocator local_b3c;
  allocator local_b3b;
  allocator local_b3a;
  uint8_t camIdx;
  AssertionResult gtest_ar_12;
  SecurityPolicy policies [2];
  json json;
  Status local_ac1;
  allocator local_ac0;
  allocator local_abf;
  allocator local_abe;
  allocator local_abd;
  NetworkId nid;
  AssertionResult gtest_ar_13;
  MatcherBase<const_ot::commissioner::Config_&> local_a98;
  _Vector_base<unsigned_char,_std::allocator<unsigned_char>_> local_a78;
  BorderRouterId rid;
  undefined1 local_a58 [8];
  MatcherBase<const_ot::commissioner::SecurityPolicy_&> MStack_a50;
  _Any_data local_a38;
  code *local_a28;
  code *pcStack_a20;
  __shared_ptr<ot::commissioner::Error,_(__gnu_cxx::_Lock_policy)2> local_a18;
  AssertionResult gtest_ar_1;
  undefined1 local_9f8 [8];
  undefined1 local_9f0 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_9e0;
  string local_9c8 [32];
  string local_9a8 [32];
  string local_988 [272];
  CommissionerAppMockPtr commissionerAppMocks [3];
  State local_83c;
  undefined1 local_838 [8];
  Value value;
  UnixTime local_6b0;
  UnixTime local_6a8;
  UnixTime local_6a0;
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  local_698;
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  local_688;
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  local_678;
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  local_668;
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  local_658;
  _Any_data local_648;
  pointer local_638;
  _func_int **pp_Stack_630;
  _Any_data local_628;
  pointer local_618;
  _func_int **pp_Stack_610;
  _Any_data local_608;
  pointer local_5f8;
  pointer psStack_5f0;
  _Any_data local_5e8;
  pointer local_5d8;
  pointer psStack_5d0;
  _Any_data local_5c8;
  pointer local_5b8;
  pointer psStack_5b0;
  _Any_data local_5a8;
  pointer local_598;
  pointer psStack_590;
  undefined1 local_588 [8];
  _Alloc_hider local_580;
  pointer local_578;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_570;
  undefined1 local_560 [8];
  _Alloc_hider local_558;
  undefined1 local_550 [8];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_548;
  undefined1 local_538 [8];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_530;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_520;
  undefined1 local_510 [16];
  pointer local_500;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_4f8;
  undefined1 local_4e8 [8];
  _Alloc_hider local_4e0;
  _Base_ptr local_4d8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_4d0;
  undefined1 local_4c0 [8];
  _Alloc_hider local_4b8;
  pointer local_4b0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_4a8;
  undefined1 local_498 [8];
  _Alloc_hider local_490;
  pointer local_488;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_480;
  undefined1 local_470 [8];
  _Alloc_hider local_468;
  _func_int **local_460;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_458;
  undefined1 local_448 [8];
  _Alloc_hider local_440;
  _func_int **local_438;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_430;
  undefined1 local_420 [40];
  TestContext ctx;
  
  JobManagerTestSuite::TestContext::TestContext(&ctx);
  JobManagerTestSuite::SetInitialExpectations(&this->super_JobManagerTestSuite,&ctx);
  gtest_ar_1._0_2_ = 0x3031;
  std::vector<unsigned_char,std::allocator<unsigned_char>>::_M_assign_aux<unsigned_char_const*>
            ((vector<unsigned_char,std::allocator<unsigned_char>> *)&ctx.mConf.mPSKc);
  ot::commissioner::persistent_storage::NetworkId::NetworkId(&nid);
  ot::commissioner::persistent_storage::BorderRouterId::BorderRouterId(&rid);
  peVar2 = ctx.mPS.
           super___shared_ptr<ot::commissioner::persistent_storage::PersistentStorageJson,_(__gnu_cxx::_Lock_policy)2>
           ._M_ptr;
  ot::commissioner::persistent_storage::NetworkId::NetworkId((NetworkId *)&converted,0);
  ot::commissioner::persistent_storage::DomainId::DomainId((DomainId *)&converted_2,0);
  std::__cxx11::string::string((string *)&value,"pan1",(allocator *)&gtest_ar_13);
  pp_Var15 = (_func_int **)0x221725;
  std::__cxx11::string::string((string *)policies,"",(allocator *)local_a58);
  ot::commissioner::persistent_storage::Network::Network
            ((Network *)&gtest_ar_1,(NetworkId *)&converted,(DomainId *)&converted_2,
             (string *)&value,1,1,1,(string *)policies,0);
  iVar4 = (*(peVar2->super_PersistentStorage)._vptr_PersistentStorage[6])(peVar2,&gtest_ar_1,&nid);
  gtest_ar_12.success_ = SUB41(iVar4,0);
  local_a38._M_unused._M_member_pointer = local_a38._M_unused._M_member_pointer & 0xffffffffffffff00
  ;
  testing::internal::
  CmpHelperEQ<ot::commissioner::persistent_storage::PersistentStorage::Status,ot::commissioner::persistent_storage::PersistentStorage::Status>
            ((internal *)commissionerAppMocks,
             "ctx.mPS->Add(Network{0, 0, \"pan1\", 1, 1, 0x1, \"\", 0}, nid)",
             "PersistentStorage::Status::kSuccess",&gtest_ar_12.success_,
             (Status *)local_a38._M_pod_data);
  ot::commissioner::persistent_storage::Network::~Network((Network *)&gtest_ar_1);
  std::__cxx11::string::~string((string *)policies);
  std::__cxx11::string::~string((string *)&value);
  if ((char)commissionerAppMocks[0].
            super___shared_ptr<CommissionerAppMock,_(__gnu_cxx::_Lock_policy)2>._M_ptr == '\0') {
    testing::Message::Message((Message *)&gtest_ar_1);
    if (commissionerAppMocks[0].super___shared_ptr<CommissionerAppMock,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      pp_Var15 = (commissionerAppMocks[0].
                  super___shared_ptr<CommissionerAppMock,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                 _M_pi)->_vptr__Sp_counted_base;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&value,kFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/cli/job_manager_test.cpp"
               ,0x238,(char *)pp_Var15);
    testing::internal::AssertHelper::operator=((AssertHelper *)&value,(Message *)&gtest_ar_1);
    this_01 = (json_value *)
              &commissionerAppMocks[0].
               super___shared_ptr<CommissionerAppMock,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&value);
    if (gtest_ar_1._0_8_ != 0) {
      (**(code **)(*(long *)gtest_ar_1._0_8_ + 8))();
    }
  }
  else {
    std::
    unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&commissionerAppMocks[0].
                      super___shared_ptr<CommissionerAppMock,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount);
    value.mError._0_8_ = value.mError._0_8_ & 0xffffffff00000000;
    testing::internal::CmpHelperEQ<unsigned_int,int>
              ((internal *)&gtest_ar_1,"nid.mId","0",&nid.mId,(int *)&value);
    if (gtest_ar_1.success_ == false) {
      testing::Message::Message((Message *)&value);
      if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )gtest_ar_1.message_._M_t.
            super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_t.
            super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            .
            super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
            ._M_head_impl ==
          (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )0x0) {
        pcVar14 = "";
      }
      else {
        pcVar14 = *(char **)gtest_ar_1.message_._M_t.
                            super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            .
                            super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                            ._M_head_impl;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)policies,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/cli/job_manager_test.cpp"
                 ,0x239,pcVar14);
      testing::internal::AssertHelper::operator=((AssertHelper *)policies,(Message *)&value);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)policies);
      if (value.mError._0_8_ != 0) {
        (**(code **)(*(long *)value.mError._0_8_ + 8))();
      }
    }
    std::
    unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~unique_ptr(&gtest_ar_1.message_);
    peVar2 = ctx.mPS.
             super___shared_ptr<ot::commissioner::persistent_storage::PersistentStorageJson,_(__gnu_cxx::_Lock_policy)2>
             ._M_ptr;
    ot::commissioner::persistent_storage::BorderRouterId::BorderRouterId
              ((BorderRouterId *)&local_a18,0);
    std::__cxx11::string::string((string *)policies,"127.0.0.1",&local_b3d);
    local_a98._vptr_MatcherBase = (_func_int **)0x0;
    local_a98.impl_.
    super___shared_ptr<const_testing::MatcherInterface<const_ot::commissioner::Config_&>,_(__gnu_cxx::_Lock_policy)2>
    ._M_ptr = (element_type *)0x0;
    local_a98.impl_.
    super___shared_ptr<const_testing::MatcherInterface<const_ot::commissioner::Config_&>,_(__gnu_cxx::_Lock_policy)2>
    ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    std::__cxx11::string::string((string *)commissionerAppMocks,"1.1",&local_b3a);
    ot::commissioner::BorderAgent::State::State((State *)(local_838 + 4),0,0,0,0,0);
    std::__cxx11::string::string((string *)&converted,"",&local_b3b);
    std::__cxx11::string::string((string *)&converted_2,"",&local_b3c);
    std::__cxx11::string::string((string *)&gtest_ar_12,"",&local_abd);
    std::__cxx11::string::string((string *)&gtest_ar_13,"",&local_abe);
    local_a78._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_a78._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_a78._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    std::__cxx11::string::string((string *)local_a58,"",&local_abf);
    pbVar17 = (pointer)0x221725;
    std::__cxx11::string::string((string *)local_a38._M_pod_data,"",&local_ac0);
    ot::commissioner::UnixTime::UnixTime(&local_6a0,0);
    ot::commissioner::BorderAgent::BorderAgent
              ((BorderAgent *)&value,(string *)policies,0x4e21,(ByteArray *)&local_a98,
               (string *)commissionerAppMocks,(State)local_838._4_4_,(string *)&converted,0,
               (string *)&converted_2,(string *)&gtest_ar_12,(Timestamp)0x0,0,(string *)&gtest_ar_13
               ,(ByteArray *)&local_a78,(string *)local_a58,'\0',0,(string *)&local_a38,local_6a0,
               0xf);
    ot::commissioner::persistent_storage::BorderRouter::BorderRouter
              ((BorderRouter *)&gtest_ar_1,(BorderRouterId *)&local_a18,&nid,(BorderAgent *)&value);
    iVar4 = (*(peVar2->super_PersistentStorage)._vptr_PersistentStorage[7])(peVar2,&gtest_ar_1,&rid)
    ;
    camIdx = (uint8_t)iVar4;
    local_ac1 = kSuccess;
    testing::internal::
    CmpHelperEQ<ot::commissioner::persistent_storage::PersistentStorage::Status,ot::commissioner::persistent_storage::PersistentStorage::Status>
              ((internal *)&json,
               "ctx.mPS->Add(BorderRouter{0, nid, BorderAgent{\"127.0.0.1\", 20001, ByteArray{}, \"1.1\", BorderAgent::State{0, 0, 0, 0, 0}, \"\", 0, \"\", \"\", Timestamp{0, 0, 0}, 0, \"\", ByteArray{}, \"\", 0, 0, \"\", 0, 0x0F}}, rid)"
               ,"PersistentStorage::Status::kSuccess",&camIdx,&local_ac1);
    ot::commissioner::persistent_storage::BorderRouter::~BorderRouter((BorderRouter *)&gtest_ar_1);
    ot::commissioner::BorderAgent::~BorderAgent((BorderAgent *)&value);
    std::__cxx11::string::~string((string *)local_a38._M_pod_data);
    std::__cxx11::string::~string((string *)local_a58);
    std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&local_a78);
    std::__cxx11::string::~string((string *)&gtest_ar_13);
    std::__cxx11::string::~string((string *)&gtest_ar_12);
    std::__cxx11::string::~string((string *)&converted_2);
    std::__cxx11::string::~string((string *)&converted);
    std::__cxx11::string::~string((string *)commissionerAppMocks);
    std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
              ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&local_a98);
    std::__cxx11::string::~string((string *)policies);
    if (json.m_type == null) {
      testing::Message::Message((Message *)&gtest_ar_1);
      if (json.m_value.object != (object_t *)0x0) {
        pbVar17 = ((json.m_value.array)->
                  super__Vector_base<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>,_std::allocator<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>_>
                  )._M_impl.super__Vector_impl_data._M_start;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&value,kFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/cli/job_manager_test.cpp"
                 ,0x240,(char *)pbVar17);
      testing::internal::AssertHelper::operator=((AssertHelper *)&value,(Message *)&gtest_ar_1);
      this_01 = &json.m_value;
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&value);
      if (gtest_ar_1._0_8_ != 0) {
        (**(code **)(*(long *)gtest_ar_1._0_8_ + 8))();
      }
    }
    else {
      std::
      unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)&json.m_value);
      value.mError._0_8_ = value.mError._0_8_ & 0xffffffff00000000;
      testing::internal::CmpHelperEQ<unsigned_int,int>
                ((internal *)&gtest_ar_1,"rid.mId","0",&rid.mId,(int *)&value);
      if (gtest_ar_1.success_ == false) {
        testing::Message::Message((Message *)&value);
        if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )gtest_ar_1.message_._M_t.
              super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_t.
              super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              .
              super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
              ._M_head_impl ==
            (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )0x0) {
          pcVar14 = "";
        }
        else {
          pcVar14 = *(char **)gtest_ar_1.message_._M_t.
                              super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_t.
                              super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              .
                              super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                              ._M_head_impl;
        }
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)policies,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/cli/job_manager_test.cpp"
                   ,0x241,pcVar14);
        testing::internal::AssertHelper::operator=((AssertHelper *)policies,(Message *)&value);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)policies);
        if (value.mError._0_8_ != 0) {
          (**(code **)(*(long *)value.mError._0_8_ + 8))();
        }
      }
      std::
      unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~unique_ptr(&gtest_ar_1.message_);
      peVar2 = ctx.mPS.
               super___shared_ptr<ot::commissioner::persistent_storage::PersistentStorageJson,_(__gnu_cxx::_Lock_policy)2>
               ._M_ptr;
      ot::commissioner::persistent_storage::NetworkId::NetworkId((NetworkId *)&converted,0);
      ot::commissioner::persistent_storage::DomainId::DomainId((DomainId *)&converted_2,0);
      std::__cxx11::string::string((string *)&value,"pan2",(allocator *)&gtest_ar_13);
      pp_Var15 = (_func_int **)0x221725;
      std::__cxx11::string::string((string *)policies,"",(allocator *)local_a58);
      ot::commissioner::persistent_storage::Network::Network
                ((Network *)&gtest_ar_1,(NetworkId *)&converted,(DomainId *)&converted_2,
                 (string *)&value,2,2,2,(string *)policies,0);
      iVar4 = (*(peVar2->super_PersistentStorage)._vptr_PersistentStorage[6])
                        (peVar2,&gtest_ar_1,&nid);
      gtest_ar_12.success_ = SUB41(iVar4,0);
      local_a38._M_unused._M_member_pointer =
           local_a38._M_unused._M_member_pointer & 0xffffffffffffff00;
      testing::internal::
      CmpHelperEQ<ot::commissioner::persistent_storage::PersistentStorage::Status,ot::commissioner::persistent_storage::PersistentStorage::Status>
                ((internal *)commissionerAppMocks,
                 "ctx.mPS->Add(Network{0, 0, \"pan2\", 2, 2, 0x2, \"\", 0}, nid)",
                 "PersistentStorage::Status::kSuccess",&gtest_ar_12.success_,
                 (Status *)local_a38._M_pod_data);
      ot::commissioner::persistent_storage::Network::~Network((Network *)&gtest_ar_1);
      std::__cxx11::string::~string((string *)policies);
      std::__cxx11::string::~string((string *)&value);
      if ((char)commissionerAppMocks[0].
                super___shared_ptr<CommissionerAppMock,_(__gnu_cxx::_Lock_policy)2>._M_ptr == '\0')
      {
        testing::Message::Message((Message *)&gtest_ar_1);
        if (commissionerAppMocks[0].
            super___shared_ptr<CommissionerAppMock,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
            (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          pp_Var15 = (commissionerAppMocks[0].
                      super___shared_ptr<CommissionerAppMock,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount._M_pi)->_vptr__Sp_counted_base;
        }
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&value,kFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/cli/job_manager_test.cpp"
                   ,0x243,(char *)pp_Var15);
        testing::internal::AssertHelper::operator=((AssertHelper *)&value,(Message *)&gtest_ar_1);
        this_01 = (json_value *)
                  &commissionerAppMocks[0].
                   super___shared_ptr<CommissionerAppMock,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&value);
        if (gtest_ar_1._0_8_ != 0) {
          (**(code **)(*(long *)gtest_ar_1._0_8_ + 8))();
        }
      }
      else {
        std::
        unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)&commissionerAppMocks[0].
                          super___shared_ptr<CommissionerAppMock,_(__gnu_cxx::_Lock_policy)2>.
                          _M_refcount);
        value.mError.mCode = kCancelled;
        testing::internal::CmpHelperEQ<unsigned_int,int>
                  ((internal *)&gtest_ar_1,"nid.mId","1",&nid.mId,(int *)&value);
        if (gtest_ar_1.success_ == false) {
          testing::Message::Message((Message *)&value);
          if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )gtest_ar_1.message_._M_t.
                super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_t.
                super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                .
                super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                ._M_head_impl ==
              (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )0x0) {
            pcVar14 = "";
          }
          else {
            pcVar14 = *(char **)gtest_ar_1.message_._M_t.
                                super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                ._M_t.
                                super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                .
                                super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                ._M_head_impl;
          }
          testing::internal::AssertHelper::AssertHelper
                    ((AssertHelper *)policies,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/cli/job_manager_test.cpp"
                     ,0x244,pcVar14);
          testing::internal::AssertHelper::operator=((AssertHelper *)policies,(Message *)&value);
          testing::internal::AssertHelper::~AssertHelper((AssertHelper *)policies);
          if (value.mError._0_8_ != 0) {
            (**(code **)(*(long *)value.mError._0_8_ + 8))();
          }
        }
        std::
        unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~unique_ptr(&gtest_ar_1.message_);
        peVar2 = ctx.mPS.
                 super___shared_ptr<ot::commissioner::persistent_storage::PersistentStorageJson,_(__gnu_cxx::_Lock_policy)2>
                 ._M_ptr;
        ot::commissioner::persistent_storage::BorderRouterId::BorderRouterId
                  ((BorderRouterId *)&local_a18,0);
        std::__cxx11::string::string((string *)policies,"127.0.0.1",&local_b3d);
        local_a98._vptr_MatcherBase = (_func_int **)0x0;
        local_a98.impl_.
        super___shared_ptr<const_testing::MatcherInterface<const_ot::commissioner::Config_&>,_(__gnu_cxx::_Lock_policy)2>
        ._M_ptr = (element_type *)0x0;
        local_a98.impl_.
        super___shared_ptr<const_testing::MatcherInterface<const_ot::commissioner::Config_&>,_(__gnu_cxx::_Lock_policy)2>
        ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        std::__cxx11::string::string((string *)commissionerAppMocks,"1.1",&local_b3a);
        ot::commissioner::BorderAgent::State::State((State *)local_838,0,0,0,0,0);
        std::__cxx11::string::string((string *)&converted,"",&local_b3b);
        std::__cxx11::string::string((string *)&converted_2,"",&local_b3c);
        std::__cxx11::string::string((string *)&gtest_ar_12,"",&local_abd);
        std::__cxx11::string::string((string *)&gtest_ar_13,"",&local_abe);
        local_a78._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        local_a78._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        local_a78._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        std::__cxx11::string::string((string *)local_a58,"",&local_abf);
        pbVar17 = (pointer)0x221725;
        std::__cxx11::string::string((string *)local_a38._M_pod_data,"",&local_ac0);
        ot::commissioner::UnixTime::UnixTime(&local_6a8,0);
        ot::commissioner::BorderAgent::BorderAgent
                  ((BorderAgent *)&value,(string *)policies,0x4e22,(ByteArray *)&local_a98,
                   (string *)commissionerAppMocks,(State)local_838._0_4_,(string *)&converted,0,
                   (string *)&converted_2,(string *)&gtest_ar_12,(Timestamp)0x0,0,
                   (string *)&gtest_ar_13,(ByteArray *)&local_a78,(string *)local_a58,'\0',0,
                   (string *)&local_a38,local_6a8,0xf);
        ot::commissioner::persistent_storage::BorderRouter::BorderRouter
                  ((BorderRouter *)&gtest_ar_1,(BorderRouterId *)&local_a18,&nid,
                   (BorderAgent *)&value);
        iVar4 = (*(peVar2->super_PersistentStorage)._vptr_PersistentStorage[7])
                          (peVar2,&gtest_ar_1,&rid);
        camIdx = (uint8_t)iVar4;
        local_ac1 = kSuccess;
        testing::internal::
        CmpHelperEQ<ot::commissioner::persistent_storage::PersistentStorage::Status,ot::commissioner::persistent_storage::PersistentStorage::Status>
                  ((internal *)&json,
                   "ctx.mPS->Add(BorderRouter{0, nid, BorderAgent{\"127.0.0.1\", 20002, ByteArray{}, \"1.1\", BorderAgent::State{0, 0, 0, 0, 0}, \"\", 0, \"\", \"\", Timestamp{0, 0, 0}, 0, \"\", ByteArray{}, \"\", 0, 0, \"\", 0, 0x0F}}, rid)"
                   ,"PersistentStorage::Status::kSuccess",&camIdx,&local_ac1);
        ot::commissioner::persistent_storage::BorderRouter::~BorderRouter
                  ((BorderRouter *)&gtest_ar_1);
        ot::commissioner::BorderAgent::~BorderAgent((BorderAgent *)&value);
        std::__cxx11::string::~string((string *)local_a38._M_pod_data);
        std::__cxx11::string::~string((string *)local_a58);
        std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&local_a78);
        std::__cxx11::string::~string((string *)&gtest_ar_13);
        std::__cxx11::string::~string((string *)&gtest_ar_12);
        std::__cxx11::string::~string((string *)&converted_2);
        std::__cxx11::string::~string((string *)&converted);
        std::__cxx11::string::~string((string *)commissionerAppMocks);
        std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                  ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&local_a98);
        std::__cxx11::string::~string((string *)policies);
        if (json.m_type == null) {
          testing::Message::Message((Message *)&gtest_ar_1);
          if (json.m_value.object != (object_t *)0x0) {
            pbVar17 = ((json.m_value.array)->
                      super__Vector_base<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>,_std::allocator<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>_>
                      )._M_impl.super__Vector_impl_data._M_start;
          }
          testing::internal::AssertHelper::AssertHelper
                    ((AssertHelper *)&value,kFatalFailure,
                     "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/cli/job_manager_test.cpp"
                     ,0x24b,(char *)pbVar17);
          testing::internal::AssertHelper::operator=((AssertHelper *)&value,(Message *)&gtest_ar_1);
          this_01 = &json.m_value;
          testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&value);
          if (gtest_ar_1._0_8_ != 0) {
            (**(code **)(*(long *)gtest_ar_1._0_8_ + 8))();
          }
        }
        else {
          std::
          unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)&json.m_value);
          value.mError.mCode = kCancelled;
          testing::internal::CmpHelperEQ<unsigned_int,int>
                    ((internal *)&gtest_ar_1,"rid.mId","1",&rid.mId,(int *)&value);
          if (gtest_ar_1.success_ == false) {
            testing::Message::Message((Message *)&value);
            if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 )gtest_ar_1.message_._M_t.
                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  .
                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                  ._M_head_impl ==
                (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 )0x0) {
              pcVar14 = "";
            }
            else {
              pcVar14 = *(char **)gtest_ar_1.message_._M_t.
                                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  ._M_t.
                                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  .
                                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                  ._M_head_impl;
            }
            testing::internal::AssertHelper::AssertHelper
                      ((AssertHelper *)policies,kNonFatalFailure,
                       "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/cli/job_manager_test.cpp"
                       ,0x24c,pcVar14);
            testing::internal::AssertHelper::operator=((AssertHelper *)policies,(Message *)&value);
            testing::internal::AssertHelper::~AssertHelper((AssertHelper *)policies);
            if (value.mError._0_8_ != 0) {
              (**(code **)(*(long *)value.mError._0_8_ + 8))();
            }
          }
          std::
          unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~unique_ptr(&gtest_ar_1.message_);
          peVar2 = ctx.mPS.
                   super___shared_ptr<ot::commissioner::persistent_storage::PersistentStorageJson,_(__gnu_cxx::_Lock_policy)2>
                   ._M_ptr;
          ot::commissioner::persistent_storage::NetworkId::NetworkId((NetworkId *)&converted,0);
          ot::commissioner::persistent_storage::DomainId::DomainId((DomainId *)&converted_2,0);
          std::__cxx11::string::string((string *)&value,"pan3",(allocator *)&gtest_ar_13);
          pp_Var15 = (_func_int **)0x221725;
          std::__cxx11::string::string((string *)policies,"",(allocator *)local_a58);
          ot::commissioner::persistent_storage::Network::Network
                    ((Network *)&gtest_ar_1,(NetworkId *)&converted,(DomainId *)&converted_2,
                     (string *)&value,3,3,3,(string *)policies,0);
          iVar4 = (*(peVar2->super_PersistentStorage)._vptr_PersistentStorage[6])
                            (peVar2,&gtest_ar_1,&nid);
          gtest_ar_12.success_ = SUB41(iVar4,0);
          local_a38._M_unused._M_member_pointer =
               local_a38._M_unused._M_member_pointer & 0xffffffffffffff00;
          testing::internal::
          CmpHelperEQ<ot::commissioner::persistent_storage::PersistentStorage::Status,ot::commissioner::persistent_storage::PersistentStorage::Status>
                    ((internal *)commissionerAppMocks,
                     "ctx.mPS->Add(Network{0, 0, \"pan3\", 3, 3, 0x3, \"\", 0}, nid)",
                     "PersistentStorage::Status::kSuccess",&gtest_ar_12.success_,
                     (Status *)local_a38._M_pod_data);
          ot::commissioner::persistent_storage::Network::~Network((Network *)&gtest_ar_1);
          std::__cxx11::string::~string((string *)policies);
          std::__cxx11::string::~string((string *)&value);
          if ((char)commissionerAppMocks[0].
                    super___shared_ptr<CommissionerAppMock,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
              '\0') {
            testing::Message::Message((Message *)&gtest_ar_1);
            if (commissionerAppMocks[0].
                super___shared_ptr<CommissionerAppMock,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              pp_Var15 = (commissionerAppMocks[0].
                          super___shared_ptr<CommissionerAppMock,_(__gnu_cxx::_Lock_policy)2>.
                          _M_refcount._M_pi)->_vptr__Sp_counted_base;
            }
            testing::internal::AssertHelper::AssertHelper
                      ((AssertHelper *)&value,kFatalFailure,
                       "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/cli/job_manager_test.cpp"
                       ,0x24e,(char *)pp_Var15);
            testing::internal::AssertHelper::operator=
                      ((AssertHelper *)&value,(Message *)&gtest_ar_1);
            this_01 = (json_value *)
                      &commissionerAppMocks[0].
                       super___shared_ptr<CommissionerAppMock,_(__gnu_cxx::_Lock_policy)2>.
                       _M_refcount;
            testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&value);
            if (gtest_ar_1._0_8_ != 0) {
              (**(code **)(*(long *)gtest_ar_1._0_8_ + 8))();
            }
          }
          else {
            std::
            unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)&commissionerAppMocks[0].
                              super___shared_ptr<CommissionerAppMock,_(__gnu_cxx::_Lock_policy)2>.
                              _M_refcount);
            value.mError.mCode = kInvalidArgs;
            testing::internal::CmpHelperEQ<unsigned_int,int>
                      ((internal *)&gtest_ar_1,"nid.mId","2",&nid.mId,(int *)&value);
            if (gtest_ar_1.success_ == false) {
              testing::Message::Message((Message *)&value);
              if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   )gtest_ar_1.message_._M_t.
                    super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_t.
                    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    .
                    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                    ._M_head_impl ==
                  (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   )0x0) {
                pcVar14 = "";
              }
              else {
                pcVar14 = *(char **)gtest_ar_1.message_._M_t.
                                    super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    ._M_t.
                                    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    .
                                    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                    ._M_head_impl;
              }
              testing::internal::AssertHelper::AssertHelper
                        ((AssertHelper *)policies,kNonFatalFailure,
                         "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/cli/job_manager_test.cpp"
                         ,0x24f,pcVar14);
              testing::internal::AssertHelper::operator=((AssertHelper *)policies,(Message *)&value)
              ;
              testing::internal::AssertHelper::~AssertHelper((AssertHelper *)policies);
              if (value.mError._0_8_ != 0) {
                (**(code **)(*(long *)value.mError._0_8_ + 8))();
              }
            }
            std::
            unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::~unique_ptr(&gtest_ar_1.message_);
            ot::commissioner::persistent_storage::BorderRouterId::BorderRouterId
                      ((BorderRouterId *)&local_a18,0);
            std::__cxx11::string::string((string *)policies,"127.0.0.1",&local_b3d);
            local_a98._vptr_MatcherBase = (_func_int **)0x0;
            local_a98.impl_.
            super___shared_ptr<const_testing::MatcherInterface<const_ot::commissioner::Config_&>,_(__gnu_cxx::_Lock_policy)2>
            ._M_ptr = (element_type *)0x0;
            local_a98.impl_.
            super___shared_ptr<const_testing::MatcherInterface<const_ot::commissioner::Config_&>,_(__gnu_cxx::_Lock_policy)2>
            ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
            std::__cxx11::string::string((string *)commissionerAppMocks,"1.1",&local_b3a);
            ot::commissioner::BorderAgent::State::State(&local_83c,0,0,0,0,0);
            std::__cxx11::string::string((string *)&converted,"",&local_b3b);
            std::__cxx11::string::string((string *)&converted_2,"",&local_b3c);
            std::__cxx11::string::string((string *)&gtest_ar_12,"",&local_abd);
            std::__cxx11::string::string((string *)&gtest_ar_13,"",&local_abe);
            local_a78._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
            local_a78._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
            local_a78._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
            std::__cxx11::string::string((string *)local_a58,"",&local_abf);
            pbVar17 = (pointer)0x221725;
            std::__cxx11::string::string((string *)local_a38._M_pod_data,"",&local_ac0);
            ot::commissioner::UnixTime::UnixTime(&local_6b0,0);
            pcVar14 = (char *)(ulong)(uint)local_83c;
            ot::commissioner::BorderAgent::BorderAgent
                      ((BorderAgent *)&value,(string *)policies,0x4e23,(ByteArray *)&local_a98,
                       (string *)commissionerAppMocks,local_83c,(string *)&converted,0,
                       (string *)&converted_2,(string *)&gtest_ar_12,(Timestamp)0x0,0,
                       (string *)&gtest_ar_13,(ByteArray *)&local_a78,(string *)local_a58,'\0',0,
                       (string *)&local_a38,local_6b0,0xf);
            ot::commissioner::persistent_storage::BorderRouter::BorderRouter
                      ((BorderRouter *)&gtest_ar_1,(BorderRouterId *)&local_a18,&nid,
                       (BorderAgent *)&value);
            iVar4 = (*((ctx.mPS.
                        super___shared_ptr<ot::commissioner::persistent_storage::PersistentStorageJson,_(__gnu_cxx::_Lock_policy)2>
                       ._M_ptr)->super_PersistentStorage)._vptr_PersistentStorage[7])
                              (ctx.mPS.
                               super___shared_ptr<ot::commissioner::persistent_storage::PersistentStorageJson,_(__gnu_cxx::_Lock_policy)2>
                               ._M_ptr,&gtest_ar_1,&rid);
            camIdx = (uint8_t)iVar4;
            local_ac1 = kSuccess;
            testing::internal::
            CmpHelperEQ<ot::commissioner::persistent_storage::PersistentStorage::Status,ot::commissioner::persistent_storage::PersistentStorage::Status>
                      ((internal *)&json,
                       "ctx.mPS->Add(BorderRouter{0, nid, BorderAgent{\"127.0.0.1\", 20003, ByteArray{}, \"1.1\", BorderAgent::State{0, 0, 0, 0, 0}, \"\", 0, \"\", \"\", Timestamp{0, 0, 0}, 0, \"\", ByteArray{}, \"\", 0, 0, \"\", 0, 0x0F}}, rid)"
                       ,"PersistentStorage::Status::kSuccess",&camIdx,&local_ac1);
            ot::commissioner::persistent_storage::BorderRouter::~BorderRouter
                      ((BorderRouter *)&gtest_ar_1);
            ot::commissioner::BorderAgent::~BorderAgent((BorderAgent *)&value);
            std::__cxx11::string::~string((string *)local_a38._M_pod_data);
            std::__cxx11::string::~string((string *)local_a58);
            std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                      (&local_a78);
            std::__cxx11::string::~string((string *)&gtest_ar_13);
            std::__cxx11::string::~string((string *)&gtest_ar_12);
            std::__cxx11::string::~string((string *)&converted_2);
            std::__cxx11::string::~string((string *)&converted);
            std::__cxx11::string::~string((string *)commissionerAppMocks);
            std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                      ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&local_a98);
            std::__cxx11::string::~string((string *)policies);
            if (json.m_type != null) {
              std::
              unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             *)&json.m_value);
              value.mError.mCode = kInvalidArgs;
              testing::internal::CmpHelperEQ<unsigned_int,int>
                        ((internal *)&gtest_ar_1,"rid.mId","2",&rid.mId,(int *)&value);
              if (gtest_ar_1.success_ == false) {
                testing::Message::Message((Message *)&value);
                if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     )gtest_ar_1.message_._M_t.
                      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      .
                      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                      ._M_head_impl ==
                    (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     )0x0) {
                  pcVar13 = "";
                }
                else {
                  pcVar13 = *(char **)gtest_ar_1.message_._M_t.
                                      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      ._M_t.
                                      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      .
                                      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                      ._M_head_impl;
                }
                testing::internal::AssertHelper::AssertHelper
                          ((AssertHelper *)policies,kNonFatalFailure,
                           "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/cli/job_manager_test.cpp"
                           ,599,pcVar13);
                testing::internal::AssertHelper::operator=
                          ((AssertHelper *)policies,(Message *)&value);
                testing::internal::AssertHelper::~AssertHelper((AssertHelper *)policies);
                if (value.mError._0_8_ != 0) {
                  (**(code **)(*(long *)value.mError._0_8_ + 8))();
                }
              }
              std::
              unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::~unique_ptr(&gtest_ar_1.message_);
              std::__cxx11::string::string((string *)&gtest_ar_1,".",(allocator *)&value);
              JobManagerTestSuite::Init(&this->super_JobManagerTestSuite,&ctx,(string *)&gtest_ar_1)
              ;
              std::__cxx11::string::~string((string *)&gtest_ar_1);
              camIdx = '\0';
              pCVar5 = (CommissionerAppMock *)operator_new(0x1838);
              memset(pCVar5,0,0x1838);
              CommissionerAppMock::CommissionerAppMock(pCVar5);
              std::__shared_ptr<CommissionerAppMock,(__gnu_cxx::_Lock_policy)2>::
              __shared_ptr<CommissionerAppMock,void>
                        ((__shared_ptr<CommissionerAppMock,(__gnu_cxx::_Lock_policy)2> *)
                         commissionerAppMocks,pCVar5);
              pCVar5 = (CommissionerAppMock *)operator_new(0x1838);
              memset(pCVar5,0,0x1838);
              CommissionerAppMock::CommissionerAppMock(pCVar5);
              std::__shared_ptr<CommissionerAppMock,(__gnu_cxx::_Lock_policy)2>::
              __shared_ptr<CommissionerAppMock,void>
                        ((__shared_ptr<CommissionerAppMock,(__gnu_cxx::_Lock_policy)2> *)
                         (commissionerAppMocks + 1),pCVar5);
              pCVar5 = (CommissionerAppMock *)operator_new(0x1838);
              memset(pCVar5,0,0x1838);
              CommissionerAppMock::CommissionerAppMock(pCVar5);
              std::__shared_ptr<CommissionerAppMock,(__gnu_cxx::_Lock_policy)2>::
              __shared_ptr<CommissionerAppMock,void>
                        ((__shared_ptr<CommissionerAppMock,(__gnu_cxx::_Lock_policy)2> *)
                         (commissionerAppMocks + 2),pCVar5);
              testing::A<std::shared_ptr<ot::commissioner::CommissionerApp>&>();
              testing::A<ot::commissioner::Config_const&>();
              CommissionerAppStaticExpecter::gmock_Create
                        ((MockSpec<ot::commissioner::Error_(std::shared_ptr<ot::commissioner::CommissionerApp>_&,_const_ot::commissioner::Config_&)>
                          *)&value,&ctx.mCommissionerAppStaticExpecter,
                         (Matcher<std::shared_ptr<ot::commissioner::CommissionerApp>_&> *)&local_a38
                         ,(Matcher<const_ot::commissioner::Config_&> *)&local_a98);
              testing::internal::GetWithoutMatchers();
              pTVar6 = testing::internal::
                       MockSpec<ot::commissioner::Error_(std::shared_ptr<ot::commissioner::CommissionerApp>_&,_const_ot::commissioner::Config_&)>
                       ::InternalExpectedAt
                                 ((MockSpec<ot::commissioner::Error_(std::shared_ptr<ot::commissioner::CommissionerApp>_&,_const_ot::commissioner::Config_&)>
                                   *)&value,
                                  "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/cli/job_manager_test.cpp"
                                  ,0x260,"ctx.mCommissionerAppStaticExpecter","Create(_, _)");
              pTVar6 = testing::internal::
                       TypedExpectation<ot::commissioner::Error_(std::shared_ptr<ot::commissioner::CommissionerApp>_&,_const_ot::commissioner::Config_&)>
                       ::Times(pTVar6,3);
              local_448._0_4_ = kNone;
              local_440._M_p = (pointer)&local_430;
              local_438 = (_func_int **)0x0;
              local_430._M_local_buf[0] = '\0';
              testing::Return<ot::commissioner::Error>((testing *)&local_a78,(Error *)local_448);
              std::__shared_ptr<ot::commissioner::Error,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                        ((__shared_ptr<ot::commissioner::Error,_(__gnu_cxx::_Lock_policy)2> *)
                         local_a58,
                         (__shared_ptr<ot::commissioner::Error,_(__gnu_cxx::_Lock_policy)2> *)
                         &local_a78);
              policies[0].mRotationTime = 0;
              policies[0]._2_6_ = 0;
              policies[0].mFlags.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
              _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
              policies[0].mFlags.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
              _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
              policies[0].mFlags.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
              converted.fun_.super__Function_base._M_manager =
                   std::
                   _Function_handler<void_(std::shared_ptr<ot::commissioner::CommissionerApp>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/cli/job_manager_test.cpp:611:30)>
                   ::_M_manager;
              converted.fun_._M_invoker =
                   std::
                   _Function_handler<void_(std::shared_ptr<ot::commissioner::CommissionerApp>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/cli/job_manager_test.cpp:611:30)>
                   ::_M_invoke;
              converted.fun_.super__Function_base._M_functor._M_unused._0_8_ =
                   (undefined8)
                   (__shared_ptr<CommissionerAppMock,(__gnu_cxx::_Lock_policy)2> *)
                   commissionerAppMocks;
              converted.fun_.super__Function_base._M_functor._8_8_ = &camIdx;
              MStack_a50.impl_.
              super___shared_ptr<const_testing::MatcherInterface<const_ot::commissioner::SecurityPolicy_&>,_(__gnu_cxx::_Lock_policy)2>
              ._M_ptr = (element_type *)commissionerAppMocks;
              MStack_a50.impl_.
              super___shared_ptr<const_testing::MatcherInterface<const_ot::commissioner::SecurityPolicy_&>,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)&camIdx;
              std::_Function_base::~_Function_base((_Function_base *)policies);
              std::function<void_(std::shared_ptr<ot::commissioner::CommissionerApp>_&)>::function
                        ((function<void_(std::shared_ptr<ot::commissioner::CommissionerApp>_&)> *)
                         &converted_2,
                         (function<void_(std::shared_ptr<ot::commissioner::CommissionerApp>_&)> *)
                         &converted);
              gtest_ar_12.success_ = false;
              gtest_ar_12._1_7_ = 0;
              gtest_ar_12.message_._M_t.
              super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_t.
              super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              .
              super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
              ._M_head_impl =
                   (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
                    )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      )0x0;
              policies[0].mFlags.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
              _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
              policies[0].mFlags.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
              policies[0].mRotationTime = 0;
              policies[0]._2_6_ = 0;
              policies[0].mFlags.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
              _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
              gtest_ar_12._0_8_ = operator_new(0x20);
              *(undefined8 *)gtest_ar_12._0_8_ = 0;
              *(undefined8 *)(gtest_ar_12._0_8_ + 8) = 0;
              *(undefined8 *)(gtest_ar_12._0_8_ + 0x10) = 0;
              *(_Invoker_type *)(gtest_ar_12._0_8_ + 0x18) = converted_2.fun_._M_invoker;
              if (converted_2.fun_.super__Function_base._M_manager != (_Manager_type)0x0) {
                *(void **)gtest_ar_12._0_8_ =
                     converted_2.fun_.super__Function_base._M_functor._M_unused._M_object;
                *(undefined8 *)(gtest_ar_12._0_8_ + 8) =
                     converted_2.fun_.super__Function_base._M_functor._8_8_;
                *(_Manager_type *)(gtest_ar_12._0_8_ + 0x10) =
                     converted_2.fun_.super__Function_base._M_manager;
                converted_2.fun_.super__Function_base._M_manager = (_Manager_type)0x0;
                converted_2.fun_._M_invoker = (_Invoker_type)0x0;
              }
              gtest_ar_12.message_._M_t.
              super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_t.
              super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              .
              super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
              ._M_head_impl =
                   (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
                    )(__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
                      )policies[0].mFlags.
                       super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                       super__Vector_impl_data._M_start;
              policies[0].mFlags.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
              _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
              policies[0].mFlags.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
              policies[0].mRotationTime = 0;
              policies[0]._2_6_ = 0;
              policies[0].mFlags.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
              _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
              std::_Function_base::~_Function_base((_Function_base *)policies);
              std::_Function_base::~_Function_base((_Function_base *)&converted_2);
              std::_Function_base::~_Function_base((_Function_base *)&converted);
              __l._M_len = 1;
              __l._M_array = (iterator)&gtest_ar_12;
              std::
              vector<testing::Action<void_(std::shared_ptr<ot::commissioner::CommissionerApp>_&,_const_ot::commissioner::Config_&)>,_std::allocator<testing::Action<void_(std::shared_ptr<ot::commissioner::CommissionerApp>_&,_const_ot::commissioner::Config_&)>_>_>
              ::vector((vector<testing::Action<void_(std::shared_ptr<ot::commissioner::CommissionerApp>_&,_const_ot::commissioner::Config_&)>,_std::allocator<testing::Action<void_(std::shared_ptr<ot::commissioner::CommissionerApp>_&,_const_ot::commissioner::Config_&)>_>_>
                        *)&gtest_ar_1,__l,(allocator_type *)policies);
              std::_Function_base::~_Function_base((_Function_base *)&gtest_ar_12);
              testing::internal::ReturnAction::operator_cast_to_Action
                        ((Action<ot::commissioner::Error_(std::shared_ptr<ot::commissioner::CommissionerApp>_&,_const_ot::commissioner::Config_&)>
                          *)local_9f0,(ReturnAction *)local_a58);
              gtest_ar_13.success_ = false;
              gtest_ar_13._1_7_ = 0;
              gtest_ar_13.message_._M_t.
              super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_t.
              super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              .
              super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
              ._M_head_impl =
                   (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
                    )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      )0x0;
              policies[0].mFlags.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
              _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
              policies[0].mFlags.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
              policies[0].mRotationTime = 0;
              policies[0]._2_6_ = 0;
              policies[0].mFlags.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
              _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
              gtest_ar_13._0_8_ = operator_new(0x38);
              *(undefined8 *)gtest_ar_13._0_8_ = gtest_ar_1._0_8_;
              ((__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
                *)(gtest_ar_13._0_8_ + 8))->
              super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   = (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      )gtest_ar_1.message_._M_t.
                       super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       .
                       super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                       ._M_head_impl;
              *(undefined1 (*) [8])(gtest_ar_13._0_8_ + 0x10) = local_9f8;
              gtest_ar_1.success_ = false;
              gtest_ar_1._1_7_ = 0;
              gtest_ar_1.message_._M_t.
              super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_t.
              super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              .
              super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
              ._M_head_impl =
                   (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
                    )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      )0x0;
              *(undefined8 *)(gtest_ar_13._0_8_ + 0x18) = 0;
              *(undefined8 *)(gtest_ar_13._0_8_ + 0x20) = 0;
              *(undefined8 *)(gtest_ar_13._0_8_ + 0x28) = 0;
              *(undefined8 *)(gtest_ar_13._0_8_ + 0x30) = local_9e0._8_8_;
              if (local_9e0._M_allocated_capacity != 0) {
                *(undefined8 *)(gtest_ar_13._0_8_ + 0x18) = local_9f0._0_8_;
                *(undefined8 *)(gtest_ar_13._0_8_ + 0x20) = local_9f0._8_8_;
                *(size_type *)(gtest_ar_13._0_8_ + 0x28) = local_9e0._M_allocated_capacity;
                local_9e0._M_allocated_capacity = 0;
                local_9e0._8_4_ = 0;
                local_9e0._12_2_ = 0;
                local_9e0._14_2_ = 0;
              }
              pCVar5 = (CommissionerAppMock *)&gtest_ar_13;
              gtest_ar_13.message_._M_t.
              super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_t.
              super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              .
              super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
              ._M_head_impl =
                   (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
                    )(__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
                      )policies[0].mFlags.
                       super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                       super__Vector_impl_data._M_start;
              policies[0].mFlags.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
              _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
              policies[0].mFlags.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
              policies[0].mRotationTime = 0;
              policies[0]._2_6_ = 0;
              policies[0].mFlags.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
              _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
              std::_Function_base::~_Function_base((_Function_base *)policies);
              anon_func::Op::~Op((Op *)&gtest_ar_1);
              testing::internal::
              TypedExpectation<ot::commissioner::Error_(std::shared_ptr<ot::commissioner::CommissionerApp>_&,_const_ot::commissioner::Config_&)>
              ::WillRepeatedly(pTVar6,(Action<ot::commissioner::Error_(std::shared_ptr<ot::commissioner::CommissionerApp>_&,_const_ot::commissioner::Config_&)>
                                       *)pCVar5);
              std::_Function_base::~_Function_base((_Function_base *)&gtest_ar_13);
              std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                        ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_a58 + 8));
              std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                        ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
                         &local_a78._M_impl.super__Vector_impl_data._M_finish);
              std::__cxx11::string::~string((string *)&local_440);
              std::
              _Tuple_impl<0UL,_testing::Matcher<std::shared_ptr<ot::commissioner::CommissionerApp>_&>,_testing::Matcher<const_ot::commissioner::Config_&>_>
              ::~_Tuple_impl((_Tuple_impl<0UL,_testing::Matcher<std::shared_ptr<ot::commissioner::CommissionerApp>_&>,_testing::Matcher<const_ot::commissioner::Config_&>_>
                              *)&value.mError.mMessage);
              testing::internal::MatcherBase<const_ot::commissioner::Config_&>::~MatcherBase
                        (&local_a98);
              testing::internal::MatcherBase<std::shared_ptr<ot::commissioner::CommissionerApp>_&>::
              ~MatcherBase((MatcherBase<std::shared_ptr<ot::commissioner::CommissionerApp>_&> *)
                           &local_a38);
              policies[0]._0_8_ =
                   CommissionerAppMock::gmock_IsActive
                             ((MockSpec<bool_()> *)
                              CONCAT71(commissionerAppMocks[0].
                                       super___shared_ptr<CommissionerAppMock,_(__gnu_cxx::_Lock_policy)2>
                                       ._M_ptr._1_7_,
                                       (char)commissionerAppMocks[0].
                                             super___shared_ptr<CommissionerAppMock,_(__gnu_cxx::_Lock_policy)2>
                                             ._M_ptr),pCVar5);
              testing::internal::GetWithoutMatchers();
              pTVar7 = testing::internal::MockSpec<bool_()>::InternalExpectedAt
                                 ((MockSpec<bool_()> *)policies,
                                  "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/cli/job_manager_test.cpp"
                                  ,0x265,"*commissionerAppMocks[0]","IsActive()");
              testing::internal::ReturnAction<bool>::ReturnAction
                        ((ReturnAction<bool> *)&converted,false);
              testing::internal::ReturnAction::operator_cast_to_Action
                        ((Action<bool_()> *)&gtest_ar_1,(ReturnAction *)&converted);
              pTVar7 = testing::internal::TypedExpectation<bool_()>::WillOnce
                                 (pTVar7,(Action<bool_()> *)&gtest_ar_1);
              testing::internal::ReturnAction<bool>::ReturnAction
                        ((ReturnAction<bool> *)&converted_2,true);
              testing::internal::ReturnAction::operator_cast_to_Action
                        ((Action<bool_()> *)&value,(ReturnAction *)&converted_2);
              pCVar5 = (CommissionerAppMock *)&value;
              testing::internal::TypedExpectation<bool_()>::WillRepeatedly
                        (pTVar7,(Action<bool_()> *)pCVar5);
              std::_Function_base::~_Function_base((_Function_base *)&value);
              std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                        ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
                         ((long)&converted_2.fun_.super__Function_base._M_functor + 8));
              std::_Function_base::~_Function_base((_Function_base *)&gtest_ar_1);
              std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                        ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
                         ((long)&converted.fun_.super__Function_base._M_functor + 8));
              policies[0]._0_8_ =
                   CommissionerAppMock::gmock_IsActive
                             ((MockSpec<bool_()> *)
                              commissionerAppMocks[1].
                              super___shared_ptr<CommissionerAppMock,_(__gnu_cxx::_Lock_policy)2>.
                              _M_ptr,pCVar5);
              testing::internal::GetWithoutMatchers();
              pTVar7 = testing::internal::MockSpec<bool_()>::InternalExpectedAt
                                 ((MockSpec<bool_()> *)policies,
                                  "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/cli/job_manager_test.cpp"
                                  ,0x266,"*commissionerAppMocks[1]","IsActive()");
              testing::internal::ReturnAction<bool>::ReturnAction
                        ((ReturnAction<bool> *)&converted,false);
              testing::internal::ReturnAction::operator_cast_to_Action
                        ((Action<bool_()> *)&gtest_ar_1,(ReturnAction *)&converted);
              pTVar7 = testing::internal::TypedExpectation<bool_()>::WillOnce
                                 (pTVar7,(Action<bool_()> *)&gtest_ar_1);
              testing::internal::ReturnAction<bool>::ReturnAction
                        ((ReturnAction<bool> *)&converted_2,true);
              testing::internal::ReturnAction::operator_cast_to_Action
                        ((Action<bool_()> *)&value,(ReturnAction *)&converted_2);
              pCVar5 = (CommissionerAppMock *)&value;
              testing::internal::TypedExpectation<bool_()>::WillRepeatedly
                        (pTVar7,(Action<bool_()> *)pCVar5);
              std::_Function_base::~_Function_base((_Function_base *)&value);
              std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                        ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
                         ((long)&converted_2.fun_.super__Function_base._M_functor + 8));
              std::_Function_base::~_Function_base((_Function_base *)&gtest_ar_1);
              std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                        ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
                         ((long)&converted.fun_.super__Function_base._M_functor + 8));
              value.mError._0_8_ =
                   CommissionerAppMock::gmock_IsActive
                             ((MockSpec<bool_()> *)
                              commissionerAppMocks[2].
                              super___shared_ptr<CommissionerAppMock,_(__gnu_cxx::_Lock_policy)2>.
                              _M_ptr,pCVar5);
              testing::internal::GetWithoutMatchers();
              pTVar7 = testing::internal::MockSpec<bool_()>::InternalExpectedAt
                                 ((MockSpec<bool_()> *)&value,
                                  "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/cli/job_manager_test.cpp"
                                  ,0x267,"*commissionerAppMocks[2]","IsActive()");
              testing::internal::ReturnAction<bool>::ReturnAction
                        ((ReturnAction<bool> *)policies,false);
              testing::internal::ReturnAction::operator_cast_to_Action
                        ((Action<bool_()> *)&gtest_ar_1,(ReturnAction *)policies);
              testing::internal::TypedExpectation<bool_()>::WillRepeatedly
                        (pTVar7,(Action<bool_()> *)&gtest_ar_1);
              std::_Function_base::~_Function_base((_Function_base *)&gtest_ar_1);
              std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                        ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&policies[0].mFlags);
              std::__cxx11::string::string((string *)&value,"start",(allocator *)local_a58);
              __l_00._M_len = 1;
              __l_00._M_array = (iterator)&value;
              std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)policies,__l_00,(allocator_type *)local_a38._M_pod_data);
              converted_2.fun_.super__Function_base._M_functor._M_unused._M_member_pointer = 1;
              converted_2.fun_.super__Function_base._M_functor._8_8_ = 2;
              converted_2.fun_.super__Function_base._M_manager = (_Manager_type)0x3;
              __l_01._M_len = 3;
              __l_01._M_array = (iterator)&converted_2;
              std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
                        ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&converted,__l_01,
                         (allocator_type *)&local_a98);
              this_00 = &ctx.mJobManager;
              ot::commissioner::JobManager::PrepareJobs
                        ((Error *)&gtest_ar_1,this_00,(Expression *)policies,
                         (vector<unsigned_long,_std::allocator<unsigned_long>_> *)&converted,false);
              gtest_ar_13._0_8_ = gtest_ar_13._0_8_ & 0xffffffff00000000;
              testing::internal::
              CmpHelperEQ<ot::commissioner::ErrorCode,ot::commissioner::ErrorCode>
                        ((internal *)&gtest_ar_12,
                         "ctx.mJobManager.PrepareJobs({\"start\"}, {0x1, 0x02, 0x03}, false).mCode",
                         "ErrorCode::kNone",(ErrorCode *)&gtest_ar_1,(ErrorCode *)&gtest_ar_13);
              std::__cxx11::string::~string((string *)&gtest_ar_1.message_);
              std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
                        ((_Vector_base<unsigned_long,_std::allocator<unsigned_long>_> *)&converted);
              std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)policies);
              std::__cxx11::string::~string((string *)&value);
              if (gtest_ar_12.success_ == false) {
                testing::Message::Message((Message *)&gtest_ar_1);
                if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     )gtest_ar_12.message_._M_t.
                      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      .
                      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                      ._M_head_impl ==
                    (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     )0x0) {
                  pcVar13 = "";
                }
                else {
                  pcVar13 = *(char **)gtest_ar_12.message_._M_t.
                                      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      ._M_t.
                                      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      .
                                      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                      ._M_head_impl;
                }
                testing::internal::AssertHelper::AssertHelper
                          ((AssertHelper *)&value,kNonFatalFailure,
                           "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/cli/job_manager_test.cpp"
                           ,0x269,pcVar13);
                testing::internal::AssertHelper::operator=
                          ((AssertHelper *)&value,(Message *)&gtest_ar_1);
                testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&value);
                if (gtest_ar_1._0_8_ != 0) {
                  (**(code **)(*(long *)gtest_ar_1._0_8_ + 8))();
                }
              }
              std::
              unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::~unique_ptr(&gtest_ar_12.message_);
              pCVar5 = (CommissionerAppMock *)
                       CONCAT71(commissionerAppMocks[0].
                                super___shared_ptr<CommissionerAppMock,_(__gnu_cxx::_Lock_policy)2>.
                                _M_ptr._1_7_,
                                (char)commissionerAppMocks[0].
                                      super___shared_ptr<CommissionerAppMock,_(__gnu_cxx::_Lock_policy)2>
                                      ._M_ptr);
              testing::A<std::__cxx11::string&>();
              testing::A<std::__cxx11::string_const&>();
              testing::A<unsigned_short>();
              CommissionerAppMock::gmock_Start
                        ((MockSpec<ot::commissioner::Error_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_unsigned_short)>
                          *)&gtest_ar_1,pCVar5,
                         (Matcher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                          *)policies,
                         (Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                          *)&converted,(Matcher<unsigned_short> *)&converted_2);
              testing::internal::GetWithoutMatchers();
              pTVar8 = testing::internal::
                       MockSpec<ot::commissioner::Error_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_unsigned_short)>
                       ::InternalExpectedAt
                                 ((MockSpec<ot::commissioner::Error_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_unsigned_short)>
                                   *)&gtest_ar_1,
                                  "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/cli/job_manager_test.cpp"
                                  ,0x26b,"*commissionerAppMocks[0]","Start(_, _, _)");
              pTVar8 = testing::internal::
                       TypedExpectation<ot::commissioner::Error_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_unsigned_short)>
                       ::Times(pTVar8,1);
              local_470._0_4_ = kNone;
              local_468._M_p = (pointer)&local_458;
              local_460 = (_func_int **)0x0;
              local_458._M_local_buf[0] = '\0';
              testing::Return<ot::commissioner::Error>((testing *)&gtest_ar_12,(Error *)local_470);
              testing::internal::ReturnAction::operator_cast_to_Action
                        ((Action<ot::commissioner::Error_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_unsigned_short)>
                          *)&value,(ReturnAction *)&gtest_ar_12);
              testing::internal::
              TypedExpectation<ot::commissioner::Error_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_unsigned_short)>
              ::WillOnce(pTVar8,(Action<ot::commissioner::Error_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_unsigned_short)>
                                 *)&value);
              std::_Function_base::~_Function_base((_Function_base *)&value);
              std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                        ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&gtest_ar_12.message_);
              std::__cxx11::string::~string((string *)&local_468);
              std::
              _Tuple_impl<0UL,_testing::Matcher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>,_testing::Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>,_testing::Matcher<unsigned_short>_>
              ::~_Tuple_impl((_Tuple_impl<0UL,_testing::Matcher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>,_testing::Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>,_testing::Matcher<unsigned_short>_>
                              *)&gtest_ar_1.message_);
              testing::internal::MatcherBase<unsigned_short>::~MatcherBase
                        ((MatcherBase<unsigned_short> *)&converted_2);
              testing::internal::
              MatcherBase<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
              ::~MatcherBase((MatcherBase<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                              *)&converted);
              testing::internal::
              MatcherBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
              ::~MatcherBase((MatcherBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                              *)policies);
              peVar1 = commissionerAppMocks[1].
                       super___shared_ptr<CommissionerAppMock,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
              testing::A<std::__cxx11::string&>();
              testing::A<std::__cxx11::string_const&>();
              testing::A<unsigned_short>();
              CommissionerAppMock::gmock_Start
                        ((MockSpec<ot::commissioner::Error_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_unsigned_short)>
                          *)&gtest_ar_1,peVar1,
                         (Matcher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                          *)policies,
                         (Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                          *)&converted,(Matcher<unsigned_short> *)&converted_2);
              testing::internal::GetWithoutMatchers();
              pTVar8 = testing::internal::
                       MockSpec<ot::commissioner::Error_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_unsigned_short)>
                       ::InternalExpectedAt
                                 ((MockSpec<ot::commissioner::Error_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_unsigned_short)>
                                   *)&gtest_ar_1,
                                  "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/cli/job_manager_test.cpp"
                                  ,0x26c,"*commissionerAppMocks[1]","Start(_, _, _)");
              pTVar8 = testing::internal::
                       TypedExpectation<ot::commissioner::Error_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_unsigned_short)>
                       ::Times(pTVar8,1);
              local_498._0_4_ = kNone;
              local_490._M_p = (pointer)&local_480;
              local_488 = (pointer)0x0;
              local_480._M_local_buf[0] = '\0';
              testing::Return<ot::commissioner::Error>((testing *)&gtest_ar_12,(Error *)local_498);
              testing::internal::ReturnAction::operator_cast_to_Action
                        ((Action<ot::commissioner::Error_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_unsigned_short)>
                          *)&value,(ReturnAction *)&gtest_ar_12);
              testing::internal::
              TypedExpectation<ot::commissioner::Error_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_unsigned_short)>
              ::WillOnce(pTVar8,(Action<ot::commissioner::Error_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_unsigned_short)>
                                 *)&value);
              std::_Function_base::~_Function_base((_Function_base *)&value);
              std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                        ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&gtest_ar_12.message_);
              std::__cxx11::string::~string((string *)&local_490);
              std::
              _Tuple_impl<0UL,_testing::Matcher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>,_testing::Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>,_testing::Matcher<unsigned_short>_>
              ::~_Tuple_impl((_Tuple_impl<0UL,_testing::Matcher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>,_testing::Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>,_testing::Matcher<unsigned_short>_>
                              *)&gtest_ar_1.message_);
              testing::internal::MatcherBase<unsigned_short>::~MatcherBase
                        ((MatcherBase<unsigned_short> *)&converted_2);
              testing::internal::
              MatcherBase<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
              ::~MatcherBase((MatcherBase<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                              *)&converted);
              testing::internal::
              MatcherBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
              ::~MatcherBase((MatcherBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                              *)policies);
              testing::A<std::__cxx11::string&>();
              testing::A<std::__cxx11::string_const&>();
              testing::A<unsigned_short>();
              CommissionerAppMock::gmock_Start
                        ((MockSpec<ot::commissioner::Error_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_unsigned_short)>
                          *)&gtest_ar_1,
                         commissionerAppMocks[2].
                         super___shared_ptr<CommissionerAppMock,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
                         (Matcher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                          *)&converted,
                         (Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                          *)&converted_2,(Matcher<unsigned_short> *)&gtest_ar_12);
              testing::internal::GetWithoutMatchers();
              pTVar8 = testing::internal::
                       MockSpec<ot::commissioner::Error_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_unsigned_short)>
                       ::InternalExpectedAt
                                 ((MockSpec<ot::commissioner::Error_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_unsigned_short)>
                                   *)&gtest_ar_1,
                                  "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/cli/job_manager_test.cpp"
                                  ,0x26d,"*commissionerAppMocks[2]","Start(_, _, _)");
              pTVar8 = testing::internal::
                       TypedExpectation<ot::commissioner::Error_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_unsigned_short)>
                       ::Times(pTVar8,1);
              std::__cxx11::string::string((string *)policies,"Aborted",(allocator *)local_a58);
              local_420._0_4_ = kAborted;
              std::__cxx11::string::string((string *)(local_420 + 8),(string *)policies);
              testing::Return<ot::commissioner::Error>((testing *)&gtest_ar_13,(Error *)local_420);
              testing::internal::ReturnAction::operator_cast_to_Action
                        ((Action<ot::commissioner::Error_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_unsigned_short)>
                          *)&value,(ReturnAction *)&gtest_ar_13);
              testing::internal::
              TypedExpectation<ot::commissioner::Error_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_unsigned_short)>
              ::WillOnce(pTVar8,(Action<ot::commissioner::Error_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_unsigned_short)>
                                 *)&value);
              std::_Function_base::~_Function_base((_Function_base *)&value);
              std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                        ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&gtest_ar_13.message_);
              std::__cxx11::string::~string((string *)(local_420 + 8));
              std::__cxx11::string::~string((string *)policies);
              std::
              _Tuple_impl<0UL,_testing::Matcher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>,_testing::Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>,_testing::Matcher<unsigned_short>_>
              ::~_Tuple_impl((_Tuple_impl<0UL,_testing::Matcher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>,_testing::Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>,_testing::Matcher<unsigned_short>_>
                              *)&gtest_ar_1.message_);
              testing::internal::MatcherBase<unsigned_short>::~MatcherBase
                        ((MatcherBase<unsigned_short> *)&gtest_ar_12);
              testing::internal::
              MatcherBase<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
              ::~MatcherBase((MatcherBase<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                              *)&converted_2);
              testing::internal::
              MatcherBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
              ::~MatcherBase((MatcherBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                              *)&converted);
              ot::commissioner::JobManager::RunJobs(this_00);
              ot::commissioner::JobManager::CollectJobsValue(&value,this_00);
              ot::commissioner::Interpreter::Value::ToString_abi_cxx11_
                        ((string *)&gtest_ar_1,&value);
              nlohmann::detail::input_adapter::
              input_adapter<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                        ((input_adapter *)policies,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &gtest_ar_1);
              local_598 = (pointer)0x0;
              psStack_590 = (pointer)0x0;
              local_5a8._M_unused._M_object = (pointer)0x0;
              local_5a8._8_8_ = (_func_int **)0x0;
              nlohmann::
              basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
              ::parse(&json,(input_adapter *)policies,(parser_callback_t *)&local_5a8,true);
              std::_Function_base::~_Function_base((_Function_base *)&local_5a8);
              std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                        ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&policies[0].mFlags);
              std::__cxx11::string::~string((string *)&gtest_ar_1);
              bVar3 = nlohmann::
                      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                      ::contains<const_char_(&)[19],_0>(&json,(char (*) [19])"0x0000000000000001");
              policies[0].mFlags.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
              _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
              policies[0].mRotationTime._0_1_ = bVar3;
              if (!bVar3) {
                testing::Message::Message((Message *)&converted);
                testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                          ((string *)&gtest_ar_1,(internal *)policies,
                           (AssertionResult *)"json.contains(\"0x0000000000000001\")","false","true"
                           ,pcVar14);
                testing::internal::AssertHelper::AssertHelper
                          ((AssertHelper *)&converted_2,kNonFatalFailure,
                           "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/cli/job_manager_test.cpp"
                           ,0x276,(char *)gtest_ar_1._0_8_);
                testing::internal::AssertHelper::operator=
                          ((AssertHelper *)&converted_2,(Message *)&converted);
                testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&converted_2);
                std::__cxx11::string::~string((string *)&gtest_ar_1);
                if (converted.fun_.super__Function_base._M_functor._M_unused._M_object !=
                    (void *)0x0) {
                  (**(code **)(*converted.fun_.super__Function_base._M_functor._M_unused._M_object +
                              8))();
                }
              }
              std::
              unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             *)&policies[0].mFlags);
              policies[0].mRotationTime._0_1_ =
                   nlohmann::
                   basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                   ::contains<const_char_(&)[19],_0>(&json,(char (*) [19])"0x0000000000000002");
              policies[0].mFlags.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
              _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
              if (!(bool)(char)policies[0].mRotationTime) {
                testing::Message::Message((Message *)&converted);
                testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                          ((string *)&gtest_ar_1,(internal *)policies,
                           (AssertionResult *)"json.contains(\"0x0000000000000002\")","false","true"
                           ,pcVar14);
                testing::internal::AssertHelper::AssertHelper
                          ((AssertHelper *)&converted_2,kNonFatalFailure,
                           "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/cli/job_manager_test.cpp"
                           ,0x277,(char *)gtest_ar_1._0_8_);
                testing::internal::AssertHelper::operator=
                          ((AssertHelper *)&converted_2,(Message *)&converted);
                testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&converted_2);
                std::__cxx11::string::~string((string *)&gtest_ar_1);
                if (converted.fun_.super__Function_base._M_functor._M_unused._M_object !=
                    (void *)0x0) {
                  (**(code **)(*converted.fun_.super__Function_base._M_functor._M_unused._M_object +
                              8))();
                }
              }
              std::
              unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             *)&policies[0].mFlags);
              bVar3 = nlohmann::
                      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                      ::contains<const_char_(&)[19],_0>(&json,(char (*) [19])"0x0000000000000003");
              policies[0].mRotationTime._0_1_ = !bVar3;
              policies[0].mFlags.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
              _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
              if (bVar3) {
                testing::Message::Message((Message *)&converted);
                testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                          ((string *)&gtest_ar_1,(internal *)policies,
                           (AssertionResult *)"json.contains(\"0x0000000000000003\")","true","false"
                           ,pcVar14);
                testing::internal::AssertHelper::AssertHelper
                          ((AssertHelper *)&converted_2,kNonFatalFailure,
                           "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/cli/job_manager_test.cpp"
                           ,0x278,(char *)gtest_ar_1._0_8_);
                testing::internal::AssertHelper::operator=
                          ((AssertHelper *)&converted_2,(Message *)&converted);
                testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&converted_2);
                std::__cxx11::string::~string((string *)&gtest_ar_1);
                if (converted.fun_.super__Function_base._M_functor._M_unused._M_object !=
                    (void *)0x0) {
                  (**(code **)(*converted.fun_.super__Function_base._M_functor._M_unused._M_object +
                              8))();
                }
              }
              std::
              unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             *)&policies[0].mFlags);
              ot::commissioner::JobManager::CleanupJobs(this_00);
              std::__cxx11::string::string
                        ((string *)policies,"active",(allocator *)local_a38._M_pod_data);
              __l_02._M_len = 1;
              __l_02._M_array = (iterator)policies;
              std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)&converted,__l_02,(allocator_type *)&local_a98);
              gtest_ar_12.success_ = true;
              gtest_ar_12._1_7_ = 0;
              gtest_ar_12.message_._M_t.
              super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_t.
              super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              .
              super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
              ._M_head_impl =
                   (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
                    )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      )0x2;
              __l_03._M_len = 3;
              __l_03._M_array = (iterator)&gtest_ar_12;
              std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
                        ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&converted_2,
                         __l_03,(allocator_type *)&local_a78);
              ot::commissioner::JobManager::PrepareJobs
                        ((Error *)&gtest_ar_1,this_00,(Expression *)&converted,
                         (vector<unsigned_long,_std::allocator<unsigned_long>_> *)&converted_2,false
                        );
              local_a58 = (undefined1  [8])((ulong)(uint)local_a58._4_4_ << 0x20);
              testing::internal::
              CmpHelperEQ<ot::commissioner::ErrorCode,ot::commissioner::ErrorCode>
                        ((internal *)&gtest_ar_13,
                         "ctx.mJobManager.PrepareJobs({\"active\"}, {0x1, 0x2, 0x3}, false).mCode",
                         "ErrorCode::kNone",(ErrorCode *)&gtest_ar_1,(ErrorCode *)local_a58);
              std::__cxx11::string::~string((string *)&gtest_ar_1.message_);
              std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
                        ((_Vector_base<unsigned_long,_std::allocator<unsigned_long>_> *)&converted_2
                        );
              std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)&converted);
              std::__cxx11::string::~string((string *)policies);
              if (gtest_ar_13.success_ == false) {
                testing::Message::Message((Message *)&gtest_ar_1);
                if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     )gtest_ar_13.message_._M_t.
                      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      .
                      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                      ._M_head_impl ==
                    (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     )0x0) {
                  pcVar13 = "";
                }
                else {
                  pcVar13 = *(char **)gtest_ar_13.message_._M_t.
                                      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      ._M_t.
                                      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      .
                                      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                      ._M_head_impl;
                }
                testing::internal::AssertHelper::AssertHelper
                          ((AssertHelper *)policies,kNonFatalFailure,
                           "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/cli/job_manager_test.cpp"
                           ,0x27c,pcVar13);
                testing::internal::AssertHelper::operator=
                          ((AssertHelper *)policies,(Message *)&gtest_ar_1);
                testing::internal::AssertHelper::~AssertHelper((AssertHelper *)policies);
                if (gtest_ar_1._0_8_ != 0) {
                  (**(code **)(*(long *)gtest_ar_1._0_8_ + 8))();
                }
              }
              std::
              unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::~unique_ptr(&gtest_ar_13.message_);
              ot::commissioner::JobManager::RunJobs(this_00);
              ot::commissioner::JobManager::CollectJobsValue((Value *)&gtest_ar_1,this_00);
              ot::commissioner::Interpreter::Value::operator=(&value,(Value *)&gtest_ar_1);
              ot::commissioner::Interpreter::Value::~Value((Value *)&gtest_ar_1);
              ot::commissioner::Interpreter::Value::ToString_abi_cxx11_
                        ((string *)&gtest_ar_1,&value);
              nlohmann::detail::input_adapter::
              input_adapter<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                        ((input_adapter *)policies,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &gtest_ar_1);
              local_5b8 = (pointer)0x0;
              psStack_5b0 = (pointer)0x0;
              local_5c8._M_unused._M_object = (pointer)0x0;
              local_5c8._8_8_ = (Timestamp)0x0;
              nlohmann::
              basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
              ::parse(&local_658,(input_adapter *)policies,(parser_callback_t *)&local_5c8,true);
              nlohmann::
              basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
              ::operator=(&json,&local_658);
              nlohmann::
              basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
              ::~basic_json(&local_658);
              std::_Function_base::~_Function_base((_Function_base *)&local_5c8);
              std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                        ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&policies[0].mFlags);
              std::__cxx11::string::~string((string *)&gtest_ar_1);
              bVar3 = nlohmann::
                      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                      ::contains<const_char_(&)[19],_0>(&json,(char (*) [19])"0x0000000000000001");
              policies[0].mFlags.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
              _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
              policies[0].mRotationTime._0_1_ = bVar3;
              if (!bVar3) {
                testing::Message::Message((Message *)&converted);
                testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                          ((string *)&gtest_ar_1,(internal *)policies,
                           (AssertionResult *)"json.contains(\"0x0000000000000001\")","false","true"
                           ,pcVar14);
                testing::internal::AssertHelper::AssertHelper
                          ((AssertHelper *)&converted_2,kNonFatalFailure,
                           "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/cli/job_manager_test.cpp"
                           ,0x280,(char *)gtest_ar_1._0_8_);
                testing::internal::AssertHelper::operator=
                          ((AssertHelper *)&converted_2,(Message *)&converted);
                testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&converted_2);
                std::__cxx11::string::~string((string *)&gtest_ar_1);
                if (converted.fun_.super__Function_base._M_functor._M_unused._M_object !=
                    (void *)0x0) {
                  (**(code **)(*converted.fun_.super__Function_base._M_functor._M_unused._M_object +
                              8))();
                }
              }
              std::
              unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             *)&policies[0].mFlags);
              policies[0].mRotationTime._0_1_ =
                   nlohmann::
                   basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                   ::contains<const_char_(&)[19],_0>(&json,(char (*) [19])"0x0000000000000002");
              policies[0].mFlags.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
              _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
              if (!(bool)(char)policies[0].mRotationTime) {
                testing::Message::Message((Message *)&converted);
                testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                          ((string *)&gtest_ar_1,(internal *)policies,
                           (AssertionResult *)"json.contains(\"0x0000000000000002\")","false","true"
                           ,pcVar14);
                testing::internal::AssertHelper::AssertHelper
                          ((AssertHelper *)&converted_2,kNonFatalFailure,
                           "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/cli/job_manager_test.cpp"
                           ,0x281,(char *)gtest_ar_1._0_8_);
                testing::internal::AssertHelper::operator=
                          ((AssertHelper *)&converted_2,(Message *)&converted);
                testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&converted_2);
                std::__cxx11::string::~string((string *)&gtest_ar_1);
                if (converted.fun_.super__Function_base._M_functor._M_unused._M_object !=
                    (void *)0x0) {
                  (**(code **)(*converted.fun_.super__Function_base._M_functor._M_unused._M_object +
                              8))();
                }
              }
              std::
              unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             *)&policies[0].mFlags);
              policies[0].mRotationTime._0_1_ =
                   nlohmann::
                   basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                   ::contains<const_char_(&)[19],_0>(&json,(char (*) [19])"0x0000000000000003");
              policies[0].mFlags.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
              _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
              if (!(bool)(char)policies[0].mRotationTime) {
                testing::Message::Message((Message *)&converted);
                testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                          ((string *)&gtest_ar_1,(internal *)policies,
                           (AssertionResult *)"json.contains(\"0x0000000000000003\")","false","true"
                           ,pcVar14);
                testing::internal::AssertHelper::AssertHelper
                          ((AssertHelper *)&converted_2,kNonFatalFailure,
                           "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/cli/job_manager_test.cpp"
                           ,0x282,(char *)gtest_ar_1._0_8_);
                testing::internal::AssertHelper::operator=
                          ((AssertHelper *)&converted_2,(Message *)&converted);
                testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&converted_2);
                std::__cxx11::string::~string((string *)&gtest_ar_1);
                if (converted.fun_.super__Function_base._M_functor._M_unused._M_object !=
                    (void *)0x0) {
                  (**(code **)(*converted.fun_.super__Function_base._M_functor._M_unused._M_object +
                              8))();
                }
              }
              std::
              unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             *)&policies[0].mFlags);
              pvVar9 = nlohmann::
                       basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
                       ::operator[]<char_const>
                                 ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
                                   *)&json,"0x0000000000000001");
              policies[0].mRotationTime._0_1_ =
                   nlohmann::
                   basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                   ::get<bool,_bool,_0>(pvVar9);
              policies[0].mFlags.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
              _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
              if (!(bool)(char)policies[0].mRotationTime) {
                testing::Message::Message((Message *)&converted);
                testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                          ((string *)&gtest_ar_1,(internal *)policies,
                           (AssertionResult *)"json[\"0x0000000000000001\"]","false","true",pcVar14)
                ;
                testing::internal::AssertHelper::AssertHelper
                          ((AssertHelper *)&converted_2,kNonFatalFailure,
                           "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/cli/job_manager_test.cpp"
                           ,0x283,(char *)gtest_ar_1._0_8_);
                testing::internal::AssertHelper::operator=
                          ((AssertHelper *)&converted_2,(Message *)&converted);
                testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&converted_2);
                std::__cxx11::string::~string((string *)&gtest_ar_1);
                if (converted.fun_.super__Function_base._M_functor._M_unused._M_object !=
                    (void *)0x0) {
                  (**(code **)(*converted.fun_.super__Function_base._M_functor._M_unused._M_object +
                              8))();
                }
              }
              std::
              unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             *)&policies[0].mFlags);
              pvVar9 = nlohmann::
                       basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
                       ::operator[]<char_const>
                                 ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
                                   *)&json,"0x0000000000000002");
              policies[0].mRotationTime._0_1_ =
                   nlohmann::
                   basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                   ::get<bool,_bool,_0>(pvVar9);
              policies[0].mFlags.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
              _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
              if (!(bool)(char)policies[0].mRotationTime) {
                testing::Message::Message((Message *)&converted);
                testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                          ((string *)&gtest_ar_1,(internal *)policies,
                           (AssertionResult *)"json[\"0x0000000000000002\"]","false","true",pcVar14)
                ;
                testing::internal::AssertHelper::AssertHelper
                          ((AssertHelper *)&converted_2,kNonFatalFailure,
                           "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/cli/job_manager_test.cpp"
                           ,0x284,(char *)gtest_ar_1._0_8_);
                testing::internal::AssertHelper::operator=
                          ((AssertHelper *)&converted_2,(Message *)&converted);
                testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&converted_2);
                std::__cxx11::string::~string((string *)&gtest_ar_1);
                if (converted.fun_.super__Function_base._M_functor._M_unused._M_object !=
                    (void *)0x0) {
                  (**(code **)(*converted.fun_.super__Function_base._M_functor._M_unused._M_object +
                              8))();
                }
              }
              std::
              unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             *)&policies[0].mFlags);
              pvVar9 = nlohmann::
                       basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
                       ::operator[]<char_const>
                                 ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
                                   *)&json,"0x0000000000000003");
              bVar3 = nlohmann::
                      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                      ::get<bool,_bool,_0>(pvVar9);
              policies[0].mRotationTime._0_1_ = !bVar3;
              policies[0].mFlags.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
              _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
              if (bVar3) {
                testing::Message::Message((Message *)&converted);
                testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                          ((string *)&gtest_ar_1,(internal *)policies,
                           (AssertionResult *)"json[\"0x0000000000000003\"]","true","false",pcVar14)
                ;
                testing::internal::AssertHelper::AssertHelper
                          ((AssertHelper *)&converted_2,kNonFatalFailure,
                           "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/cli/job_manager_test.cpp"
                           ,0x285,(char *)gtest_ar_1._0_8_);
                testing::internal::AssertHelper::operator=
                          ((AssertHelper *)&converted_2,(Message *)&converted);
                testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&converted_2);
                std::__cxx11::string::~string((string *)&gtest_ar_1);
                if (converted.fun_.super__Function_base._M_functor._M_unused._M_object !=
                    (void *)0x0) {
                  (**(code **)(*converted.fun_.super__Function_base._M_functor._M_unused._M_object +
                              8))();
                }
              }
              std::
              unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             *)&policies[0].mFlags);
              ot::commissioner::JobManager::CleanupJobs(this_00);
              std::__cxx11::string::string
                        ((string *)policies,"sessionid",(allocator *)local_a38._M_pod_data);
              __l_04._M_len = 1;
              __l_04._M_array = (iterator)policies;
              std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)&converted,__l_04,(allocator_type *)&local_a98);
              gtest_ar_13.success_ = true;
              gtest_ar_13._1_7_ = 0;
              gtest_ar_13.message_._M_t.
              super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_t.
              super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              .
              super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
              ._M_head_impl =
                   (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
                    )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      )0x2;
              __l_05._M_len = 2;
              __l_05._M_array = (iterator)&gtest_ar_13;
              std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
                        ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&converted_2,
                         __l_05,(allocator_type *)&local_a78);
              ot::commissioner::JobManager::PrepareJobs
                        ((Error *)&gtest_ar_1,this_00,(Expression *)&converted,
                         (vector<unsigned_long,_std::allocator<unsigned_long>_> *)&converted_2,false
                        );
              local_a58 = (undefined1  [8])((ulong)local_a58 & 0xffffffff00000000);
              testing::internal::
              CmpHelperEQ<ot::commissioner::ErrorCode,ot::commissioner::ErrorCode>
                        ((internal *)&gtest_ar_12,
                         "ctx.mJobManager.PrepareJobs({\"sessionid\"}, {0x1, 0x2}, false).mCode",
                         "ErrorCode::kNone",(ErrorCode *)&gtest_ar_1,(ErrorCode *)local_a58);
              std::__cxx11::string::~string((string *)&gtest_ar_1.message_);
              std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
                        ((_Vector_base<unsigned_long,_std::allocator<unsigned_long>_> *)&converted_2
                        );
              std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)&converted);
              std::__cxx11::string::~string((string *)policies);
              if (gtest_ar_12.success_ == false) {
                testing::Message::Message((Message *)&gtest_ar_1);
                if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     )gtest_ar_12.message_._M_t.
                      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      .
                      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                      ._M_head_impl ==
                    (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     )0x0) {
                  pcVar13 = "";
                }
                else {
                  pcVar13 = *(char **)gtest_ar_12.message_._M_t.
                                      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      ._M_t.
                                      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      .
                                      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                      ._M_head_impl;
                }
                testing::internal::AssertHelper::AssertHelper
                          ((AssertHelper *)policies,kNonFatalFailure,
                           "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/cli/job_manager_test.cpp"
                           ,0x289,pcVar13);
                testing::internal::AssertHelper::operator=
                          ((AssertHelper *)policies,(Message *)&gtest_ar_1);
                testing::internal::AssertHelper::~AssertHelper((AssertHelper *)policies);
                if (gtest_ar_1._0_8_ != 0) {
                  (**(code **)(*(long *)gtest_ar_1._0_8_ + 8))();
                }
              }
              std::
              unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::~unique_ptr(&gtest_ar_12.message_);
              pCVar5 = (CommissionerAppMock *)
                       CONCAT71(commissionerAppMocks[0].
                                super___shared_ptr<CommissionerAppMock,_(__gnu_cxx::_Lock_policy)2>.
                                _M_ptr._1_7_,
                                (char)commissionerAppMocks[0].
                                      super___shared_ptr<CommissionerAppMock,_(__gnu_cxx::_Lock_policy)2>
                                      ._M_ptr);
              testing::A<unsigned_short&>();
              CommissionerAppMock::gmock_GetSessionId
                        ((MockSpec<ot::commissioner::Error_(unsigned_short_&)> *)&gtest_ar_13,pCVar5
                         ,(Matcher<unsigned_short_&> *)&local_a38);
              testing::internal::GetWithoutMatchers();
              pTVar10 = testing::internal::MockSpec<ot::commissioner::Error_(unsigned_short_&)>::
                        InternalExpectedAt((MockSpec<ot::commissioner::Error_(unsigned_short_&)> *)
                                           &gtest_ar_13,
                                           "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/cli/job_manager_test.cpp"
                                           ,0x28a,"*commissionerAppMocks[0]","GetSessionId(_)");
              local_4c0._0_4_ = kNone;
              local_4b8._M_p = (pointer)&local_4a8;
              local_4b0 = (pointer)0x0;
              local_4a8._M_local_buf[0] = '\0';
              testing::Return<ot::commissioner::Error>((testing *)&local_a78,(Error *)local_4c0);
              std::__shared_ptr<ot::commissioner::Error,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                        ((__shared_ptr<ot::commissioner::Error,_(__gnu_cxx::_Lock_policy)2> *)
                         &local_a98,
                         (__shared_ptr<ot::commissioner::Error,_(__gnu_cxx::_Lock_policy)2> *)
                         &local_a78);
              policies[0].mRotationTime = 0;
              policies[0]._2_6_ = 0;
              policies[0].mFlags.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
              _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
              converted.fun_.super__Function_base._M_functor._M_unused._M_object = (void *)0x0;
              converted.fun_.super__Function_base._M_functor._8_8_ = 0;
              policies[0].mFlags.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
              _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
              policies[0].mFlags.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
              converted.fun_.super__Function_base._M_manager =
                   std::
                   _Function_handler<void_(unsigned_short_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/cli/job_manager_test.cpp:651:36)>
                   ::_M_manager;
              converted.fun_._M_invoker =
                   std::
                   _Function_handler<void_(unsigned_short_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/cli/job_manager_test.cpp:651:36)>
                   ::_M_invoke;
              std::_Function_base::~_Function_base((_Function_base *)policies);
              std::function<void_(unsigned_short_&)>::function
                        ((function<void_(unsigned_short_&)> *)&converted_2,&converted.fun_);
              gtest_ar_12.success_ = false;
              gtest_ar_12._1_7_ = 0;
              gtest_ar_12.message_._M_t.
              super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_t.
              super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              .
              super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
              ._M_head_impl =
                   (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
                    )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      )0x0;
              policies[0].mFlags.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
              _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
              policies[0].mFlags.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
              policies[0].mRotationTime = 0;
              policies[0]._2_6_ = 0;
              policies[0].mFlags.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
              _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
              gtest_ar_12._0_8_ = operator_new(0x20);
              *(undefined8 *)gtest_ar_12._0_8_ = 0;
              *(undefined8 *)(gtest_ar_12._0_8_ + 8) = 0;
              *(undefined8 *)(gtest_ar_12._0_8_ + 0x10) = 0;
              *(_Invoker_type *)(gtest_ar_12._0_8_ + 0x18) = converted_2.fun_._M_invoker;
              if (converted_2.fun_.super__Function_base._M_manager != (_Manager_type)0x0) {
                *(void **)gtest_ar_12._0_8_ =
                     converted_2.fun_.super__Function_base._M_functor._M_unused._M_object;
                *(undefined8 *)(gtest_ar_12._0_8_ + 8) =
                     converted_2.fun_.super__Function_base._M_functor._8_8_;
                *(_Manager_type *)(gtest_ar_12._0_8_ + 0x10) =
                     converted_2.fun_.super__Function_base._M_manager;
                converted_2.fun_.super__Function_base._M_manager = (_Manager_type)0x0;
                converted_2.fun_._M_invoker = (_Invoker_type)0x0;
              }
              gtest_ar_12.message_._M_t.
              super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_t.
              super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              .
              super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
              ._M_head_impl =
                   (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
                    )(__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
                      )policies[0].mFlags.
                       super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                       super__Vector_impl_data._M_start;
              policies[0].mFlags.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
              _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
              policies[0].mFlags.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
              policies[0].mRotationTime = 0;
              policies[0]._2_6_ = 0;
              policies[0].mFlags.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
              _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
              std::_Function_base::~_Function_base((_Function_base *)policies);
              std::_Function_base::~_Function_base((_Function_base *)&converted_2);
              std::_Function_base::~_Function_base((_Function_base *)&converted);
              __l_06._M_len = 1;
              __l_06._M_array = (iterator)&gtest_ar_12;
              std::
              vector<testing::Action<void_(unsigned_short_&)>,_std::allocator<testing::Action<void_(unsigned_short_&)>_>_>
              ::vector((vector<testing::Action<void_(unsigned_short_&)>,_std::allocator<testing::Action<void_(unsigned_short_&)>_>_>
                        *)&gtest_ar_1,__l_06,(allocator_type *)policies);
              std::_Function_base::~_Function_base((_Function_base *)&gtest_ar_12);
              testing::internal::ReturnAction::operator_cast_to_Action
                        ((Action<ot::commissioner::Error_(unsigned_short_&)> *)local_9f0,
                         (ReturnAction *)&local_a98);
              MStack_a50.impl_.
              super___shared_ptr<const_testing::MatcherInterface<const_ot::commissioner::SecurityPolicy_&>,_(__gnu_cxx::_Lock_policy)2>
              ._M_ptr = (element_type *)0x0;
              MStack_a50.impl_.
              super___shared_ptr<const_testing::MatcherInterface<const_ot::commissioner::SecurityPolicy_&>,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
              local_a58 = (undefined1  [8])0x0;
              MStack_a50._vptr_MatcherBase = (_func_int **)0x0;
              policies[0].mFlags.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
              _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
              policies[0].mFlags.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
              policies[0].mRotationTime = 0;
              policies[0]._2_6_ = 0;
              policies[0].mFlags.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
              _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
              local_a58 = (undefined1  [8])operator_new(0x38);
              *(undefined8 *)local_a58 = gtest_ar_1._0_8_;
              ((__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
                *)((long)local_a58 + 8))->
              super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   = (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      )gtest_ar_1.message_._M_t.
                       super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       .
                       super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                       ._M_head_impl;
              *(undefined8 *)((long)local_a58 + 0x10) = 0;
              gtest_ar_1.success_ = false;
              gtest_ar_1._1_7_ = 0;
              gtest_ar_1.message_._M_t.
              super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_t.
              super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              .
              super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
              ._M_head_impl =
                   (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
                    )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      )0x0;
              *(undefined8 *)((long)local_a58 + 0x18) = 0;
              *(undefined8 *)((long)local_a58 + 0x20) = 0;
              *(undefined8 *)((long)local_a58 + 0x28) = 0;
              *(undefined8 *)((long)local_a58 + 0x30) = local_9e0._8_8_;
              if (local_9e0._M_allocated_capacity != 0) {
                *(undefined8 *)((long)local_a58 + 0x18) = local_9f0._0_8_;
                *(undefined8 *)((long)local_a58 + 0x20) = local_9f0._8_8_;
                *(size_type *)((long)local_a58 + 0x28) = local_9e0._M_allocated_capacity;
                local_9e0._M_allocated_capacity = 0;
                local_9e0._8_4_ = 0;
                local_9e0._12_2_ = 0;
                local_9e0._14_2_ = 0;
              }
              MStack_a50._vptr_MatcherBase =
                   (_func_int **)
                   policies[0].mFlags.
                   super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                   super__Vector_impl_data._M_start;
              policies[0].mFlags.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
              _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
              policies[0].mFlags.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
              policies[0].mRotationTime = 0;
              policies[0]._2_6_ = 0;
              policies[0].mFlags.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
              _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
              MStack_a50.impl_.
              super___shared_ptr<const_testing::MatcherInterface<const_ot::commissioner::SecurityPolicy_&>,_(__gnu_cxx::_Lock_policy)2>
              ._M_ptr = (element_type *)std::_Function_handler::operator_cast_to_Action;
              MStack_a50.impl_.
              super___shared_ptr<const_testing::MatcherInterface<const_ot::commissioner::SecurityPolicy_&>,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount._M_pi =
                   (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                   std::_Function_handler::operator_cast_to_Action;
              std::_Function_base::~_Function_base((_Function_base *)policies);
              anon_func::Op::~Op((Op *)&gtest_ar_1);
              testing::internal::TypedExpectation<ot::commissioner::Error_(unsigned_short_&)>::
              WillOnce(pTVar10,(Action<ot::commissioner::Error_(unsigned_short_&)> *)local_a58);
              std::_Function_base::~_Function_base((_Function_base *)local_a58);
              std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                        ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_a98.impl_);
              std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                        ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
                         &local_a78._M_impl.super__Vector_impl_data._M_finish);
              std::__cxx11::string::~string((string *)&local_4b8);
              testing::internal::MatcherBase<unsigned_short_&>::~MatcherBase
                        ((MatcherBase<unsigned_short_&> *)&gtest_ar_13.message_);
              testing::internal::MatcherBase<unsigned_short_&>::~MatcherBase
                        ((MatcherBase<unsigned_short_&> *)&local_a38);
              peVar1 = commissionerAppMocks[1].
                       super___shared_ptr<CommissionerAppMock,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
              testing::A<unsigned_short&>();
              CommissionerAppMock::gmock_GetSessionId
                        ((MockSpec<ot::commissioner::Error_(unsigned_short_&)> *)&gtest_ar_13,peVar1
                         ,(Matcher<unsigned_short_&> *)&local_a38);
              testing::internal::GetWithoutMatchers();
              pTVar10 = testing::internal::MockSpec<ot::commissioner::Error_(unsigned_short_&)>::
                        InternalExpectedAt((MockSpec<ot::commissioner::Error_(unsigned_short_&)> *)
                                           &gtest_ar_13,
                                           "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/cli/job_manager_test.cpp"
                                           ,0x28c,"*commissionerAppMocks[1]","GetSessionId(_)");
              local_4e8._0_4_ = kNone;
              local_4e0._M_p = (pointer)&local_4d0;
              local_4d8 = (_Base_ptr)0x0;
              local_4d0._M_local_buf[0] = '\0';
              testing::Return<ot::commissioner::Error>((testing *)&local_a78,(Error *)local_4e8);
              std::__shared_ptr<ot::commissioner::Error,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                        ((__shared_ptr<ot::commissioner::Error,_(__gnu_cxx::_Lock_policy)2> *)
                         &local_a98,
                         (__shared_ptr<ot::commissioner::Error,_(__gnu_cxx::_Lock_policy)2> *)
                         &local_a78);
              policies[0].mRotationTime = 0;
              policies[0]._2_6_ = 0;
              policies[0].mFlags.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
              _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
              converted.fun_.super__Function_base._M_functor._M_unused._M_object = (void *)0x0;
              converted.fun_.super__Function_base._M_functor._8_8_ = 0;
              policies[0].mFlags.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
              _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
              policies[0].mFlags.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
              converted.fun_.super__Function_base._M_manager =
                   std::
                   _Function_handler<void_(unsigned_short_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/cli/job_manager_test.cpp:653:36)>
                   ::_M_manager;
              converted.fun_._M_invoker =
                   std::
                   _Function_handler<void_(unsigned_short_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/cli/job_manager_test.cpp:653:36)>
                   ::_M_invoke;
              std::_Function_base::~_Function_base((_Function_base *)policies);
              std::function<void_(unsigned_short_&)>::function
                        ((function<void_(unsigned_short_&)> *)&converted_2,&converted.fun_);
              gtest_ar_12.success_ = false;
              gtest_ar_12._1_7_ = 0;
              gtest_ar_12.message_._M_t.
              super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_t.
              super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              .
              super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
              ._M_head_impl =
                   (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
                    )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      )0x0;
              policies[0].mFlags.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
              _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
              policies[0].mFlags.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
              policies[0].mRotationTime = 0;
              policies[0]._2_6_ = 0;
              policies[0].mFlags.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
              _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
              gtest_ar_12._0_8_ = operator_new(0x20);
              *(undefined8 *)gtest_ar_12._0_8_ = 0;
              *(undefined8 *)(gtest_ar_12._0_8_ + 8) = 0;
              *(undefined8 *)(gtest_ar_12._0_8_ + 0x10) = 0;
              *(_Invoker_type *)(gtest_ar_12._0_8_ + 0x18) = converted_2.fun_._M_invoker;
              if (converted_2.fun_.super__Function_base._M_manager != (_Manager_type)0x0) {
                *(void **)gtest_ar_12._0_8_ =
                     converted_2.fun_.super__Function_base._M_functor._M_unused._M_object;
                *(undefined8 *)(gtest_ar_12._0_8_ + 8) =
                     converted_2.fun_.super__Function_base._M_functor._8_8_;
                *(_Manager_type *)(gtest_ar_12._0_8_ + 0x10) =
                     converted_2.fun_.super__Function_base._M_manager;
                converted_2.fun_.super__Function_base._M_manager = (_Manager_type)0x0;
                converted_2.fun_._M_invoker = (_Invoker_type)0x0;
              }
              gtest_ar_12.message_._M_t.
              super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_t.
              super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              .
              super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
              ._M_head_impl =
                   (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
                    )(__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
                      )policies[0].mFlags.
                       super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                       super__Vector_impl_data._M_start;
              policies[0].mFlags.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
              _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
              policies[0].mFlags.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
              policies[0].mRotationTime = 0;
              policies[0]._2_6_ = 0;
              policies[0].mFlags.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
              _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
              std::_Function_base::~_Function_base((_Function_base *)policies);
              std::_Function_base::~_Function_base((_Function_base *)&converted_2);
              std::_Function_base::~_Function_base((_Function_base *)&converted);
              __l_07._M_len = 1;
              __l_07._M_array = (iterator)&gtest_ar_12;
              std::
              vector<testing::Action<void_(unsigned_short_&)>,_std::allocator<testing::Action<void_(unsigned_short_&)>_>_>
              ::vector((vector<testing::Action<void_(unsigned_short_&)>,_std::allocator<testing::Action<void_(unsigned_short_&)>_>_>
                        *)&gtest_ar_1,__l_07,(allocator_type *)policies);
              std::_Function_base::~_Function_base((_Function_base *)&gtest_ar_12);
              testing::internal::ReturnAction::operator_cast_to_Action
                        ((Action<ot::commissioner::Error_(unsigned_short_&)> *)local_9f0,
                         (ReturnAction *)&local_a98);
              MStack_a50.impl_.
              super___shared_ptr<const_testing::MatcherInterface<const_ot::commissioner::SecurityPolicy_&>,_(__gnu_cxx::_Lock_policy)2>
              ._M_ptr = (element_type *)0x0;
              MStack_a50.impl_.
              super___shared_ptr<const_testing::MatcherInterface<const_ot::commissioner::SecurityPolicy_&>,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
              local_a58 = (undefined1  [8])0x0;
              MStack_a50._vptr_MatcherBase = (_func_int **)0x0;
              policies[0].mFlags.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
              _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
              policies[0].mFlags.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
              policies[0].mRotationTime = 0;
              policies[0]._2_6_ = 0;
              policies[0].mFlags.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
              _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
              local_a58 = (undefined1  [8])operator_new(0x38);
              *(undefined8 *)local_a58 = gtest_ar_1._0_8_;
              ((__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
                *)((long)local_a58 + 8))->
              super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   = (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      )gtest_ar_1.message_._M_t.
                       super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       .
                       super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                       ._M_head_impl;
              *(undefined8 *)((long)local_a58 + 0x10) = 0;
              gtest_ar_1.success_ = false;
              gtest_ar_1._1_7_ = 0;
              gtest_ar_1.message_._M_t.
              super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_t.
              super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              .
              super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
              ._M_head_impl =
                   (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
                    )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      )0x0;
              *(undefined8 *)((long)local_a58 + 0x18) = 0;
              *(undefined8 *)((long)local_a58 + 0x20) = 0;
              *(undefined8 *)((long)local_a58 + 0x28) = 0;
              *(undefined8 *)((long)local_a58 + 0x30) = local_9e0._8_8_;
              if (local_9e0._M_allocated_capacity != 0) {
                *(undefined8 *)((long)local_a58 + 0x18) = local_9f0._0_8_;
                *(undefined8 *)((long)local_a58 + 0x20) = local_9f0._8_8_;
                *(size_type *)((long)local_a58 + 0x28) = local_9e0._M_allocated_capacity;
                local_9e0._M_allocated_capacity = 0;
                local_9e0._8_4_ = 0;
                local_9e0._12_2_ = 0;
                local_9e0._14_2_ = 0;
              }
              MStack_a50._vptr_MatcherBase =
                   (_func_int **)
                   policies[0].mFlags.
                   super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                   super__Vector_impl_data._M_start;
              policies[0].mFlags.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
              _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
              policies[0].mFlags.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
              policies[0].mRotationTime = 0;
              policies[0]._2_6_ = 0;
              policies[0].mFlags.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
              _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
              MStack_a50.impl_.
              super___shared_ptr<const_testing::MatcherInterface<const_ot::commissioner::SecurityPolicy_&>,_(__gnu_cxx::_Lock_policy)2>
              ._M_ptr = (element_type *)std::_Function_handler::operator_cast_to_Action;
              MStack_a50.impl_.
              super___shared_ptr<const_testing::MatcherInterface<const_ot::commissioner::SecurityPolicy_&>,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount._M_pi =
                   (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                   std::_Function_handler::operator_cast_to_Action;
              std::_Function_base::~_Function_base((_Function_base *)policies);
              anon_func::Op::~Op((Op *)&gtest_ar_1);
              testing::internal::TypedExpectation<ot::commissioner::Error_(unsigned_short_&)>::
              WillOnce(pTVar10,(Action<ot::commissioner::Error_(unsigned_short_&)> *)local_a58);
              std::_Function_base::~_Function_base((_Function_base *)local_a58);
              std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                        ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_a98.impl_);
              std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                        ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
                         &local_a78._M_impl.super__Vector_impl_data._M_finish);
              std::__cxx11::string::~string((string *)&local_4e0);
              testing::internal::MatcherBase<unsigned_short_&>::~MatcherBase
                        ((MatcherBase<unsigned_short_&> *)&gtest_ar_13.message_);
              testing::internal::MatcherBase<unsigned_short_&>::~MatcherBase
                        ((MatcherBase<unsigned_short_&> *)&local_a38);
              ot::commissioner::JobManager::RunJobs(this_00);
              ot::commissioner::JobManager::CollectJobsValue((Value *)&gtest_ar_1,this_00);
              ot::commissioner::Interpreter::Value::operator=(&value,(Value *)&gtest_ar_1);
              ot::commissioner::Interpreter::Value::~Value((Value *)&gtest_ar_1);
              ot::commissioner::Interpreter::Value::ToString_abi_cxx11_
                        ((string *)&gtest_ar_1,&value);
              nlohmann::detail::input_adapter::
              input_adapter<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                        ((input_adapter *)policies,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &gtest_ar_1);
              local_5d8 = (pointer)0x0;
              psStack_5d0 = (pointer)0x0;
              local_5e8._M_unused._M_object = (_func_int **)0x0;
              local_5e8._8_8_ = (pointer)0x0;
              nlohmann::
              basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
              ::parse(&local_668,(input_adapter *)policies,(parser_callback_t *)&local_5e8,true);
              nlohmann::
              basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
              ::operator=(&json,&local_668);
              nlohmann::
              basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
              ::~basic_json(&local_668);
              std::_Function_base::~_Function_base((_Function_base *)&local_5e8);
              std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                        ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&policies[0].mFlags);
              std::__cxx11::string::~string((string *)&gtest_ar_1);
              bVar3 = nlohmann::
                      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                      ::contains<const_char_(&)[19],_0>(&json,(char (*) [19])"0x0000000000000001");
              policies[0].mFlags.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
              _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
              policies[0].mRotationTime._0_1_ = bVar3;
              if (!bVar3) {
                testing::Message::Message((Message *)&converted);
                testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                          ((string *)&gtest_ar_1,(internal *)policies,
                           (AssertionResult *)"json.contains(\"0x0000000000000001\")","false","true"
                           ,pcVar14);
                testing::internal::AssertHelper::AssertHelper
                          ((AssertHelper *)&converted_2,kNonFatalFailure,
                           "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/cli/job_manager_test.cpp"
                           ,0x291,(char *)gtest_ar_1._0_8_);
                testing::internal::AssertHelper::operator=
                          ((AssertHelper *)&converted_2,(Message *)&converted);
                testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&converted_2);
                std::__cxx11::string::~string((string *)&gtest_ar_1);
                if (converted.fun_.super__Function_base._M_functor._M_unused._M_object !=
                    (void *)0x0) {
                  (**(code **)(*converted.fun_.super__Function_base._M_functor._M_unused._M_object +
                              8))();
                }
              }
              std::
              unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             *)&policies[0].mFlags);
              policies[0].mRotationTime._0_1_ =
                   nlohmann::
                   basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                   ::contains<const_char_(&)[19],_0>(&json,(char (*) [19])"0x0000000000000002");
              policies[0].mFlags.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
              _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
              if (!(bool)(char)policies[0].mRotationTime) {
                testing::Message::Message((Message *)&converted);
                testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                          ((string *)&gtest_ar_1,(internal *)policies,
                           (AssertionResult *)"json.contains(\"0x0000000000000002\")","false","true"
                           ,pcVar14);
                testing::internal::AssertHelper::AssertHelper
                          ((AssertHelper *)&converted_2,kNonFatalFailure,
                           "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/cli/job_manager_test.cpp"
                           ,0x292,(char *)gtest_ar_1._0_8_);
                testing::internal::AssertHelper::operator=
                          ((AssertHelper *)&converted_2,(Message *)&converted);
                testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&converted_2);
                std::__cxx11::string::~string((string *)&gtest_ar_1);
                if (converted.fun_.super__Function_base._M_functor._M_unused._M_object !=
                    (void *)0x0) {
                  (**(code **)(*converted.fun_.super__Function_base._M_functor._M_unused._M_object +
                              8))();
                }
              }
              std::
              unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             *)&policies[0].mFlags);
              pvVar9 = nlohmann::
                       basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
                       ::operator[]<char_const>
                                 ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
                                   *)&json,"0x0000000000000001");
              policies[0]._0_8_ = policies[0]._0_8_ & 0xffffffff00000000;
              testing::internal::
              CmpHelperEQ<nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>,int>
                        ((internal *)&gtest_ar_1,"json[\"0x0000000000000001\"]","0",pvVar9,
                         (int *)policies);
              if (gtest_ar_1.success_ == false) {
                testing::Message::Message((Message *)policies);
                if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     )gtest_ar_1.message_._M_t.
                      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      .
                      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                      ._M_head_impl ==
                    (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     )0x0) {
                  pcVar13 = "";
                }
                else {
                  pcVar13 = *(char **)gtest_ar_1.message_._M_t.
                                      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      ._M_t.
                                      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      .
                                      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                      ._M_head_impl;
                }
                testing::internal::AssertHelper::AssertHelper
                          ((AssertHelper *)&converted,kNonFatalFailure,
                           "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/cli/job_manager_test.cpp"
                           ,0x293,pcVar13);
                testing::internal::AssertHelper::operator=
                          ((AssertHelper *)&converted,(Message *)policies);
                testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&converted);
                if (policies[0]._0_8_ != 0) {
                  (**(code **)(*(long *)policies[0]._0_8_ + 8))();
                }
              }
              std::
              unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::~unique_ptr(&gtest_ar_1.message_);
              pvVar9 = nlohmann::
                       basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
                       ::operator[]<char_const>
                                 ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
                                   *)&json,"0x0000000000000002");
              policies[0]._0_4_ = 1;
              testing::internal::
              CmpHelperEQ<nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>,int>
                        ((internal *)&gtest_ar_1,"json[\"0x0000000000000002\"]","1",pvVar9,
                         (int *)policies);
              if (gtest_ar_1.success_ == false) {
                testing::Message::Message((Message *)policies);
                if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     )gtest_ar_1.message_._M_t.
                      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      .
                      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                      ._M_head_impl ==
                    (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     )0x0) {
                  pcVar13 = "";
                }
                else {
                  pcVar13 = *(char **)gtest_ar_1.message_._M_t.
                                      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      ._M_t.
                                      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      .
                                      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                      ._M_head_impl;
                }
                testing::internal::AssertHelper::AssertHelper
                          ((AssertHelper *)&converted,kNonFatalFailure,
                           "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/cli/job_manager_test.cpp"
                           ,0x294,pcVar13);
                testing::internal::AssertHelper::operator=
                          ((AssertHelper *)&converted,(Message *)policies);
                testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&converted);
                if (policies[0]._0_8_ != 0) {
                  (**(code **)(*(long *)policies[0]._0_8_ + 8))();
                }
              }
              std::
              unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::~unique_ptr(&gtest_ar_1.message_);
              ot::commissioner::JobManager::CleanupJobs(this_00);
              std::__cxx11::string::string
                        ((string *)&gtest_ar_1,"opdataset",(allocator *)local_a38._M_pod_data);
              std::__cxx11::string::string((string *)(local_9f0 + 8),"get",(allocator *)&local_a98);
              std::__cxx11::string::string(local_9c8,"active",(allocator *)&local_a78);
              __l_08._M_len = 3;
              __l_08._M_array = (iterator)&gtest_ar_1;
              std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)&converted,__l_08,(allocator_type *)&local_a18);
              gtest_ar_13.success_ = true;
              gtest_ar_13._1_7_ = 0;
              gtest_ar_13.message_._M_t.
              super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_t.
              super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              .
              super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
              ._M_head_impl =
                   (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
                    )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      )0x2;
              __l_09._M_len = 2;
              __l_09._M_array = (iterator)&gtest_ar_13;
              std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
                        ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&converted_2,
                         __l_09,(allocator_type *)&local_b3d);
              ot::commissioner::JobManager::PrepareJobs
                        ((Error *)policies,this_00,(Expression *)&converted,
                         (vector<unsigned_long,_std::allocator<unsigned_long>_> *)&converted_2,false
                        );
              local_a58 = (undefined1  [8])((ulong)local_a58 & 0xffffffff00000000);
              testing::internal::
              CmpHelperEQ<ot::commissioner::ErrorCode,ot::commissioner::ErrorCode>
                        ((internal *)&gtest_ar_12,
                         "ctx.mJobManager.PrepareJobs({\"opdataset\", \"get\", \"active\"}, {0x1, 0x2}, false).mCode"
                         ,"ErrorCode::kNone",(ErrorCode *)policies,(ErrorCode *)local_a58);
              std::__cxx11::string::~string((string *)&policies[0].mFlags);
              std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
                        ((_Vector_base<unsigned_long,_std::allocator<unsigned_long>_> *)&converted_2
                        );
              std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)&converted);
              lVar16 = 0x40;
              do {
                std::__cxx11::string::~string((string *)(&gtest_ar_1.success_ + lVar16));
                lVar16 = lVar16 + -0x20;
              } while (lVar16 != -0x20);
              if (gtest_ar_12.success_ == false) {
                testing::Message::Message((Message *)&gtest_ar_1);
                if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     )gtest_ar_12.message_._M_t.
                      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      .
                      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                      ._M_head_impl ==
                    (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     )0x0) {
                  pcVar13 = "";
                }
                else {
                  pcVar13 = *(char **)gtest_ar_12.message_._M_t.
                                      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      ._M_t.
                                      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      .
                                      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                      ._M_head_impl;
                }
                testing::internal::AssertHelper::AssertHelper
                          ((AssertHelper *)policies,kNonFatalFailure,
                           "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/cli/job_manager_test.cpp"
                           ,0x298,pcVar13);
                testing::internal::AssertHelper::operator=
                          ((AssertHelper *)policies,(Message *)&gtest_ar_1);
                testing::internal::AssertHelper::~AssertHelper((AssertHelper *)policies);
                if (gtest_ar_1._0_8_ != 0) {
                  (**(code **)(*(long *)gtest_ar_1._0_8_ + 8))();
                }
              }
              std::
              unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::~unique_ptr(&gtest_ar_12.message_);
              pCVar5 = (CommissionerAppMock *)
                       CONCAT71(commissionerAppMocks[0].
                                super___shared_ptr<CommissionerAppMock,_(__gnu_cxx::_Lock_policy)2>.
                                _M_ptr._1_7_,
                                (char)commissionerAppMocks[0].
                                      super___shared_ptr<CommissionerAppMock,_(__gnu_cxx::_Lock_policy)2>
                                      ._M_ptr);
              testing::A<ot::commissioner::ActiveOperationalDataset&>();
              testing::A<unsigned_short>();
              CommissionerAppMock::gmock_GetActiveDataset
                        ((MockSpec<ot::commissioner::Error_(ot::commissioner::ActiveOperationalDataset_&,_unsigned_short)>
                          *)policies,pCVar5,
                         (Matcher<ot::commissioner::ActiveOperationalDataset_&> *)&local_a38,
                         (Matcher<unsigned_short> *)&local_a98);
              testing::internal::GetWithoutMatchers();
              pTVar11 = testing::internal::
                        MockSpec<ot::commissioner::Error_(ot::commissioner::ActiveOperationalDataset_&,_unsigned_short)>
                        ::InternalExpectedAt
                                  ((MockSpec<ot::commissioner::Error_(ot::commissioner::ActiveOperationalDataset_&,_unsigned_short)>
                                    *)policies,
                                   "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/cli/job_manager_test.cpp"
                                   ,0x299,"*commissionerAppMocks[0]","GetActiveDataset(_, _)");
              local_510._0_4_ = 0;
              local_510._8_8_ = &local_4f8;
              local_500 = (pointer)0x0;
              local_4f8._M_local_buf[0] = '\0';
              testing::Return<ot::commissioner::Error>((testing *)&local_a18,(Error *)local_510);
              std::__shared_ptr<ot::commissioner::Error,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                        ((__shared_ptr<ot::commissioner::Error,_(__gnu_cxx::_Lock_policy)2> *)
                         &local_a78,&local_a18);
              converted.fun_.super__Function_base._M_functor._M_unused._M_object = (void *)0x0;
              converted.fun_.super__Function_base._M_functor._8_8_ = 0;
              converted_2.fun_.super__Function_base._M_functor._M_unused._M_object = (void *)0x0;
              converted_2.fun_.super__Function_base._M_functor._8_8_ = 0;
              converted.fun_.super__Function_base._M_manager = (_Manager_type)0x0;
              converted.fun_._M_invoker = (_Invoker_type)0x0;
              converted_2.fun_.super__Function_base._M_manager =
                   std::
                   _Function_handler<void_(ot::commissioner::ActiveOperationalDataset_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/cli/job_manager_test.cpp:666:37)>
                   ::_M_manager;
              converted_2.fun_._M_invoker =
                   std::
                   _Function_handler<void_(ot::commissioner::ActiveOperationalDataset_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/cli/job_manager_test.cpp:666:37)>
                   ::_M_invoke;
              std::_Function_base::~_Function_base((_Function_base *)&converted);
              std::function<void_(ot::commissioner::ActiveOperationalDataset_&)>::function
                        ((function<void_(ot::commissioner::ActiveOperationalDataset_&)> *)
                         &gtest_ar_12,&converted_2.fun_);
              gtest_ar_13.success_ = false;
              gtest_ar_13._1_7_ = 0;
              gtest_ar_13.message_._M_t.
              super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_t.
              super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              .
              super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
              ._M_head_impl =
                   (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
                    )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      )0x0;
              converted.fun_.super__Function_base._M_manager = (_Manager_type)0x0;
              converted.fun_._M_invoker = (_Invoker_type)0x0;
              converted.fun_.super__Function_base._M_functor._M_unused._M_object = (void *)0x0;
              converted.fun_.super__Function_base._M_functor._8_8_ = 0;
              gtest_ar_13._0_8_ = operator_new(0x20);
              *(undefined8 *)gtest_ar_13._0_8_ = 0;
              *(undefined8 *)(gtest_ar_13._0_8_ + 8) = 0;
              *(undefined8 *)(gtest_ar_13._0_8_ + 0x10) = 0;
              *(code **)(gtest_ar_13._0_8_ + 0x18) = std::_Function_handler::operator_cast_to_Action
              ;
              *(undefined8 *)gtest_ar_13._0_8_ = gtest_ar_12._0_8_;
              ((__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
                *)(gtest_ar_13._0_8_ + 8))->
              super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   = (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      )gtest_ar_12.message_._M_t.
                       super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       .
                       super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                       ._M_head_impl;
              *(code **)(gtest_ar_13._0_8_ + 0x10) = std::_Function_handler::operator_cast_to_Action
              ;
              gtest_ar_13.message_._M_t.
              super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_t.
              super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              .
              super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
              ._M_head_impl =
                   (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
                    )(__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
                      )converted.fun_.super__Function_base._M_functor._8_8_;
              converted.fun_.super__Function_base._M_manager = (_Manager_type)0x0;
              converted.fun_._M_invoker = (_Invoker_type)0x0;
              converted.fun_.super__Function_base._M_functor._M_unused._M_object = (void *)0x0;
              converted.fun_.super__Function_base._M_functor._8_8_ = 0;
              std::_Function_base::~_Function_base((_Function_base *)&converted);
              std::_Function_base::~_Function_base((_Function_base *)&gtest_ar_12);
              std::_Function_base::~_Function_base((_Function_base *)&converted_2);
              __l_10._M_len = 1;
              __l_10._M_array = (iterator)&gtest_ar_13;
              std::
              vector<testing::Action<void_(ot::commissioner::ActiveOperationalDataset_&,_unsigned_short)>,_std::allocator<testing::Action<void_(ot::commissioner::ActiveOperationalDataset_&,_unsigned_short)>_>_>
              ::vector((vector<testing::Action<void_(ot::commissioner::ActiveOperationalDataset_&,_unsigned_short)>,_std::allocator<testing::Action<void_(ot::commissioner::ActiveOperationalDataset_&,_unsigned_short)>_>_>
                        *)&gtest_ar_1,__l_10,(allocator_type *)&converted);
              std::_Function_base::~_Function_base((_Function_base *)&gtest_ar_13);
              testing::internal::ReturnAction::operator_cast_to_Action
                        ((Action<ot::commissioner::Error_(ot::commissioner::ActiveOperationalDataset_&,_unsigned_short)>
                          *)local_9f0,(ReturnAction *)&local_a78);
              MStack_a50.impl_.
              super___shared_ptr<const_testing::MatcherInterface<const_ot::commissioner::SecurityPolicy_&>,_(__gnu_cxx::_Lock_policy)2>
              ._M_ptr = (element_type *)0x0;
              MStack_a50.impl_.
              super___shared_ptr<const_testing::MatcherInterface<const_ot::commissioner::SecurityPolicy_&>,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
              local_a58 = (undefined1  [8])0x0;
              MStack_a50._vptr_MatcherBase = (_func_int **)0x0;
              converted.fun_.super__Function_base._M_manager = (_Manager_type)0x0;
              converted.fun_._M_invoker = (_Invoker_type)0x0;
              converted.fun_.super__Function_base._M_functor._M_unused._M_object = (void *)0x0;
              converted.fun_.super__Function_base._M_functor._8_8_ = 0;
              local_a58 = (undefined1  [8])operator_new(0x38);
              *(undefined8 *)local_a58 = gtest_ar_1._0_8_;
              ((__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
                *)((long)local_a58 + 8))->
              super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   = (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      )gtest_ar_1.message_._M_t.
                       super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       .
                       super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                       ._M_head_impl;
              *(undefined8 *)((long)local_a58 + 0x10) = 0;
              gtest_ar_1.success_ = false;
              gtest_ar_1._1_7_ = 0;
              gtest_ar_1.message_._M_t.
              super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_t.
              super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              .
              super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
              ._M_head_impl =
                   (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
                    )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      )0x0;
              *(undefined8 *)((long)local_a58 + 0x18) = 0;
              *(undefined8 *)((long)local_a58 + 0x20) = 0;
              *(undefined8 *)((long)local_a58 + 0x28) = 0;
              *(undefined8 *)((long)local_a58 + 0x30) = local_9e0._8_8_;
              if (local_9e0._M_allocated_capacity != 0) {
                *(undefined8 *)((long)local_a58 + 0x18) = local_9f0._0_8_;
                *(undefined8 *)((long)local_a58 + 0x20) = local_9f0._8_8_;
                *(size_type *)((long)local_a58 + 0x28) = local_9e0._M_allocated_capacity;
                local_9e0._M_allocated_capacity = 0;
                local_9e0._8_4_ = 0;
                local_9e0._12_2_ = 0;
                local_9e0._14_2_ = 0;
              }
              MStack_a50._vptr_MatcherBase =
                   (_func_int **)converted.fun_.super__Function_base._M_functor._8_8_;
              converted.fun_.super__Function_base._M_manager = (_Manager_type)0x0;
              converted.fun_._M_invoker = (_Invoker_type)0x0;
              converted.fun_.super__Function_base._M_functor._M_unused._M_object = (void *)0x0;
              converted.fun_.super__Function_base._M_functor._8_8_ = 0;
              MStack_a50.impl_.
              super___shared_ptr<const_testing::MatcherInterface<const_ot::commissioner::SecurityPolicy_&>,_(__gnu_cxx::_Lock_policy)2>
              ._M_ptr = (element_type *)std::_Function_handler::operator_cast_to_Action;
              MStack_a50.impl_.
              super___shared_ptr<const_testing::MatcherInterface<const_ot::commissioner::SecurityPolicy_&>,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount._M_pi =
                   (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                   std::_Function_handler::operator_cast_to_Action;
              std::_Function_base::~_Function_base((_Function_base *)&converted);
              anon_func::Op::~Op((Op *)&gtest_ar_1);
              testing::internal::
              TypedExpectation<ot::commissioner::Error_(ot::commissioner::ActiveOperationalDataset_&,_unsigned_short)>
              ::WillOnce(pTVar11,(Action<ot::commissioner::Error_(ot::commissioner::ActiveOperationalDataset_&,_unsigned_short)>
                                  *)local_a58);
              std::_Function_base::~_Function_base((_Function_base *)local_a58);
              std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                        ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
                         &local_a78._M_impl.super__Vector_impl_data._M_finish);
              std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                        (&local_a18._M_refcount);
              std::__cxx11::string::~string((string *)(local_510 + 8));
              std::
              _Tuple_impl<0UL,_testing::Matcher<ot::commissioner::ActiveOperationalDataset_&>,_testing::Matcher<unsigned_short>_>
              ::~_Tuple_impl((_Tuple_impl<0UL,_testing::Matcher<ot::commissioner::ActiveOperationalDataset_&>,_testing::Matcher<unsigned_short>_>
                              *)&policies[0].mFlags);
              testing::internal::MatcherBase<unsigned_short>::~MatcherBase
                        ((MatcherBase<unsigned_short> *)&local_a98);
              testing::internal::MatcherBase<ot::commissioner::ActiveOperationalDataset_&>::
              ~MatcherBase((MatcherBase<ot::commissioner::ActiveOperationalDataset_&> *)&local_a38);
              peVar1 = commissionerAppMocks[1].
                       super___shared_ptr<CommissionerAppMock,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
              testing::A<ot::commissioner::ActiveOperationalDataset&>();
              testing::A<unsigned_short>();
              CommissionerAppMock::gmock_GetActiveDataset
                        ((MockSpec<ot::commissioner::Error_(ot::commissioner::ActiveOperationalDataset_&,_unsigned_short)>
                          *)policies,peVar1,
                         (Matcher<ot::commissioner::ActiveOperationalDataset_&> *)&local_a38,
                         (Matcher<unsigned_short> *)&local_a98);
              testing::internal::GetWithoutMatchers();
              pTVar11 = testing::internal::
                        MockSpec<ot::commissioner::Error_(ot::commissioner::ActiveOperationalDataset_&,_unsigned_short)>
                        ::InternalExpectedAt
                                  ((MockSpec<ot::commissioner::Error_(ot::commissioner::ActiveOperationalDataset_&,_unsigned_short)>
                                    *)policies,
                                   "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/cli/job_manager_test.cpp"
                                   ,0x29f,"*commissionerAppMocks[1]","GetActiveDataset(_, _)");
              local_538._0_4_ = kNone;
              local_530._M_allocated_capacity = (size_type)&local_520;
              local_530._8_8_ = (pointer)0x0;
              local_520._M_local_buf[0] = '\0';
              testing::Return<ot::commissioner::Error>((testing *)&local_a18,(Error *)local_538);
              std::__shared_ptr<ot::commissioner::Error,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                        ((__shared_ptr<ot::commissioner::Error,_(__gnu_cxx::_Lock_policy)2> *)
                         &local_a78,&local_a18);
              converted.fun_.super__Function_base._M_functor._M_unused._M_object = (void *)0x0;
              converted.fun_.super__Function_base._M_functor._8_8_ = 0;
              converted_2.fun_.super__Function_base._M_functor._M_unused._M_object = (void *)0x0;
              converted_2.fun_.super__Function_base._M_functor._8_8_ = 0;
              converted.fun_.super__Function_base._M_manager = (_Manager_type)0x0;
              converted.fun_._M_invoker = (_Invoker_type)0x0;
              converted_2.fun_.super__Function_base._M_manager =
                   std::
                   _Function_handler<void_(ot::commissioner::ActiveOperationalDataset_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/cli/job_manager_test.cpp:672:37)>
                   ::_M_manager;
              converted_2.fun_._M_invoker =
                   std::
                   _Function_handler<void_(ot::commissioner::ActiveOperationalDataset_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/cli/job_manager_test.cpp:672:37)>
                   ::_M_invoke;
              std::_Function_base::~_Function_base((_Function_base *)&converted);
              std::function<void_(ot::commissioner::ActiveOperationalDataset_&)>::function
                        ((function<void_(ot::commissioner::ActiveOperationalDataset_&)> *)
                         &gtest_ar_12,&converted_2.fun_);
              gtest_ar_13.success_ = false;
              gtest_ar_13._1_7_ = 0;
              gtest_ar_13.message_._M_t.
              super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_t.
              super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              .
              super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
              ._M_head_impl =
                   (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
                    )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      )0x0;
              converted.fun_.super__Function_base._M_manager = (_Manager_type)0x0;
              converted.fun_._M_invoker = (_Invoker_type)0x0;
              converted.fun_.super__Function_base._M_functor._M_unused._M_object = (void *)0x0;
              converted.fun_.super__Function_base._M_functor._8_8_ = 0;
              gtest_ar_13._0_8_ = operator_new(0x20);
              *(undefined8 *)gtest_ar_13._0_8_ = 0;
              *(undefined8 *)(gtest_ar_13._0_8_ + 8) = 0;
              *(undefined8 *)(gtest_ar_13._0_8_ + 0x10) = 0;
              *(undefined8 *)(gtest_ar_13._0_8_ + 0x18) = 0;
              gtest_ar_13.message_._M_t.
              super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_t.
              super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              .
              super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
              ._M_head_impl =
                   (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
                    )(__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
                      )converted.fun_.super__Function_base._M_functor._8_8_;
              converted.fun_.super__Function_base._M_manager = (_Manager_type)0x0;
              converted.fun_._M_invoker = (_Invoker_type)0x0;
              converted.fun_.super__Function_base._M_functor._M_unused._M_object = (void *)0x0;
              converted.fun_.super__Function_base._M_functor._8_8_ = 0;
              std::_Function_base::~_Function_base((_Function_base *)&converted);
              std::_Function_base::~_Function_base((_Function_base *)&gtest_ar_12);
              std::_Function_base::~_Function_base((_Function_base *)&converted_2);
              __l_11._M_len = 1;
              __l_11._M_array = (iterator)&gtest_ar_13;
              std::
              vector<testing::Action<void_(ot::commissioner::ActiveOperationalDataset_&,_unsigned_short)>,_std::allocator<testing::Action<void_(ot::commissioner::ActiveOperationalDataset_&,_unsigned_short)>_>_>
              ::vector((vector<testing::Action<void_(ot::commissioner::ActiveOperationalDataset_&,_unsigned_short)>,_std::allocator<testing::Action<void_(ot::commissioner::ActiveOperationalDataset_&,_unsigned_short)>_>_>
                        *)&gtest_ar_1,__l_11,(allocator_type *)&converted);
              std::_Function_base::~_Function_base((_Function_base *)&gtest_ar_13);
              testing::internal::ReturnAction::operator_cast_to_Action
                        ((Action<ot::commissioner::Error_(ot::commissioner::ActiveOperationalDataset_&,_unsigned_short)>
                          *)local_9f0,(ReturnAction *)&local_a78);
              MStack_a50.impl_.
              super___shared_ptr<const_testing::MatcherInterface<const_ot::commissioner::SecurityPolicy_&>,_(__gnu_cxx::_Lock_policy)2>
              ._M_ptr = (element_type *)0x0;
              MStack_a50.impl_.
              super___shared_ptr<const_testing::MatcherInterface<const_ot::commissioner::SecurityPolicy_&>,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
              local_a58 = (undefined1  [8])0x0;
              MStack_a50._vptr_MatcherBase = (_func_int **)0x0;
              converted.fun_.super__Function_base._M_manager = (_Manager_type)0x0;
              converted.fun_._M_invoker = (_Invoker_type)0x0;
              converted.fun_.super__Function_base._M_functor._M_unused._M_object = (void *)0x0;
              converted.fun_.super__Function_base._M_functor._8_8_ = 0;
              local_a58 = (undefined1  [8])operator_new(0x38);
              *(undefined8 *)local_a58 = gtest_ar_1._0_8_;
              ((__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
                *)((long)local_a58 + 8))->
              super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   = (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      )gtest_ar_1.message_._M_t.
                       super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       .
                       super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                       ._M_head_impl;
              *(undefined8 *)((long)local_a58 + 0x10) = 0;
              gtest_ar_1.success_ = false;
              gtest_ar_1._1_7_ = 0;
              gtest_ar_1.message_._M_t.
              super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_t.
              super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              .
              super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
              ._M_head_impl =
                   (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
                    )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      )0x0;
              *(undefined8 *)((long)local_a58 + 0x18) = 0;
              *(undefined8 *)((long)local_a58 + 0x20) = 0;
              *(undefined8 *)((long)local_a58 + 0x28) = 0;
              *(undefined8 *)((long)local_a58 + 0x30) = local_9e0._8_8_;
              if (local_9e0._M_allocated_capacity != 0) {
                *(undefined8 *)((long)local_a58 + 0x18) = local_9f0._0_8_;
                *(undefined8 *)((long)local_a58 + 0x20) = local_9f0._8_8_;
                *(size_type *)((long)local_a58 + 0x28) = local_9e0._M_allocated_capacity;
                local_9e0._M_allocated_capacity = 0;
                local_9e0._8_4_ = 0;
                local_9e0._12_2_ = 0;
                local_9e0._14_2_ = 0;
              }
              MStack_a50._vptr_MatcherBase =
                   (_func_int **)converted.fun_.super__Function_base._M_functor._8_8_;
              converted.fun_.super__Function_base._M_manager = (_Manager_type)0x0;
              converted.fun_._M_invoker = (_Invoker_type)0x0;
              converted.fun_.super__Function_base._M_functor._M_unused._M_object = (void *)0x0;
              converted.fun_.super__Function_base._M_functor._8_8_ = 0;
              MStack_a50.impl_.
              super___shared_ptr<const_testing::MatcherInterface<const_ot::commissioner::SecurityPolicy_&>,_(__gnu_cxx::_Lock_policy)2>
              ._M_ptr = (element_type *)std::_Function_handler::operator_cast_to_Action;
              MStack_a50.impl_.
              super___shared_ptr<const_testing::MatcherInterface<const_ot::commissioner::SecurityPolicy_&>,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount._M_pi =
                   (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                   std::_Function_handler::operator_cast_to_Action;
              std::_Function_base::~_Function_base((_Function_base *)&converted);
              anon_func::Op::~Op((Op *)&gtest_ar_1);
              testing::internal::
              TypedExpectation<ot::commissioner::Error_(ot::commissioner::ActiveOperationalDataset_&,_unsigned_short)>
              ::WillOnce(pTVar11,(Action<ot::commissioner::Error_(ot::commissioner::ActiveOperationalDataset_&,_unsigned_short)>
                                  *)local_a58);
              std::_Function_base::~_Function_base((_Function_base *)local_a58);
              std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                        ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
                         &local_a78._M_impl.super__Vector_impl_data._M_finish);
              std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                        (&local_a18._M_refcount);
              std::__cxx11::string::~string((string *)(local_538 + 8));
              std::
              _Tuple_impl<0UL,_testing::Matcher<ot::commissioner::ActiveOperationalDataset_&>,_testing::Matcher<unsigned_short>_>
              ::~_Tuple_impl((_Tuple_impl<0UL,_testing::Matcher<ot::commissioner::ActiveOperationalDataset_&>,_testing::Matcher<unsigned_short>_>
                              *)&policies[0].mFlags);
              testing::internal::MatcherBase<unsigned_short>::~MatcherBase
                        ((MatcherBase<unsigned_short> *)&local_a98);
              testing::internal::MatcherBase<ot::commissioner::ActiveOperationalDataset_&>::
              ~MatcherBase((MatcherBase<ot::commissioner::ActiveOperationalDataset_&> *)&local_a38);
              ot::commissioner::JobManager::RunJobs(this_00);
              ot::commissioner::JobManager::CollectJobsValue((Value *)&gtest_ar_1,this_00);
              ot::commissioner::Interpreter::Value::operator=(&value,(Value *)&gtest_ar_1);
              ot::commissioner::Interpreter::Value::~Value((Value *)&gtest_ar_1);
              ot::commissioner::Interpreter::Value::ToString_abi_cxx11_
                        ((string *)&gtest_ar_1,&value);
              nlohmann::detail::input_adapter::
              input_adapter<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                        ((input_adapter *)policies,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &gtest_ar_1);
              local_5f8 = (pointer)0x0;
              psStack_5f0 = (pointer)0x0;
              local_608._M_unused._M_object = (pointer)0x0;
              local_608._8_8_ = (pointer)0x0;
              nlohmann::
              basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
              ::parse(&local_678,(input_adapter *)policies,(parser_callback_t *)&local_608,true);
              nlohmann::
              basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
              ::operator=(&json,&local_678);
              nlohmann::
              basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
              ::~basic_json(&local_678);
              std::_Function_base::~_Function_base((_Function_base *)&local_608);
              std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                        ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&policies[0].mFlags);
              std::__cxx11::string::~string((string *)&gtest_ar_1);
              bVar3 = nlohmann::
                      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                      ::contains<const_char_(&)[19],_0>(&json,(char (*) [19])"0x0000000000000001");
              policies[0].mFlags.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
              _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
              policies[0].mRotationTime._0_1_ = bVar3;
              if (!bVar3) {
                testing::Message::Message((Message *)&converted);
                testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                          ((string *)&gtest_ar_1,(internal *)policies,
                           (AssertionResult *)"json.contains(\"0x0000000000000001\")","false","true"
                           ,pcVar14);
                testing::internal::AssertHelper::AssertHelper
                          ((AssertHelper *)&converted_2,kNonFatalFailure,
                           "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/cli/job_manager_test.cpp"
                           ,0x2a8,(char *)gtest_ar_1._0_8_);
                testing::internal::AssertHelper::operator=
                          ((AssertHelper *)&converted_2,(Message *)&converted);
                testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&converted_2);
                std::__cxx11::string::~string((string *)&gtest_ar_1);
                if (converted.fun_.super__Function_base._M_functor._M_unused._M_object !=
                    (void *)0x0) {
                  (**(code **)(*converted.fun_.super__Function_base._M_functor._M_unused._M_object +
                              8))();
                }
              }
              std::
              unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             *)&policies[0].mFlags);
              policies[0].mRotationTime._0_1_ =
                   nlohmann::
                   basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                   ::contains<const_char_(&)[19],_0>(&json,(char (*) [19])"0x0000000000000002");
              policies[0].mFlags.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
              _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
              if (!(bool)(char)policies[0].mRotationTime) {
                testing::Message::Message((Message *)&converted);
                testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                          ((string *)&gtest_ar_1,(internal *)policies,
                           (AssertionResult *)"json.contains(\"0x0000000000000002\")","false","true"
                           ,pcVar14);
                testing::internal::AssertHelper::AssertHelper
                          ((AssertHelper *)&converted_2,kNonFatalFailure,
                           "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/cli/job_manager_test.cpp"
                           ,0x2a9,(char *)gtest_ar_1._0_8_);
                testing::internal::AssertHelper::operator=
                          ((AssertHelper *)&converted_2,(Message *)&converted);
                testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&converted_2);
                std::__cxx11::string::~string((string *)&gtest_ar_1);
                if (converted.fun_.super__Function_base._M_functor._M_unused._M_object !=
                    (void *)0x0) {
                  (**(code **)(*converted.fun_.super__Function_base._M_functor._M_unused._M_object +
                              8))();
                }
              }
              std::
              unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             *)&policies[0].mFlags);
              pvVar9 = nlohmann::
                       basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
                       ::operator[]<char_const>
                                 ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
                                   *)&json,"0x0000000000000001");
              policies[0].mRotationTime._0_1_ =
                   nlohmann::
                   basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                   ::contains<const_char_(&)[6],_0>(pvVar9,(char (*) [6])0x20ca2d);
              policies[0].mFlags.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
              _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
              if (!(bool)(char)policies[0].mRotationTime) {
                testing::Message::Message((Message *)&converted);
                testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                          ((string *)&gtest_ar_1,(internal *)policies,
                           (AssertionResult *)"json[\"0x0000000000000001\"].contains(\"PanId\")",
                           "false","true",pcVar14);
                testing::internal::AssertHelper::AssertHelper
                          ((AssertHelper *)&converted_2,kNonFatalFailure,
                           "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/cli/job_manager_test.cpp"
                           ,0x2aa,(char *)gtest_ar_1._0_8_);
                testing::internal::AssertHelper::operator=
                          ((AssertHelper *)&converted_2,(Message *)&converted);
                testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&converted_2);
                std::__cxx11::string::~string((string *)&gtest_ar_1);
                if (converted.fun_.super__Function_base._M_functor._M_unused._M_object !=
                    (void *)0x0) {
                  (**(code **)(*converted.fun_.super__Function_base._M_functor._M_unused._M_object +
                              8))();
                }
              }
              std::
              unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             *)&policies[0].mFlags);
              pvVar9 = nlohmann::
                       basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
                       ::operator[]<char_const>
                                 ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
                                   *)&json,"0x0000000000000002");
              policies[0].mRotationTime._0_1_ =
                   nlohmann::
                   basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                   ::contains<const_char_(&)[6],_0>(pvVar9,(char (*) [6])0x20ca2d);
              policies[0].mFlags.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
              _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
              if (!(bool)(char)policies[0].mRotationTime) {
                testing::Message::Message((Message *)&converted);
                testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                          ((string *)&gtest_ar_1,(internal *)policies,
                           (AssertionResult *)"json[\"0x0000000000000002\"].contains(\"PanId\")",
                           "false","true",pcVar14);
                testing::internal::AssertHelper::AssertHelper
                          ((AssertHelper *)&converted_2,kNonFatalFailure,
                           "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/cli/job_manager_test.cpp"
                           ,0x2ab,(char *)gtest_ar_1._0_8_);
                testing::internal::AssertHelper::operator=
                          ((AssertHelper *)&converted_2,(Message *)&converted);
                testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&converted_2);
                std::__cxx11::string::~string((string *)&gtest_ar_1);
                if (converted.fun_.super__Function_base._M_functor._M_unused._M_object !=
                    (void *)0x0) {
                  (**(code **)(*converted.fun_.super__Function_base._M_functor._M_unused._M_object +
                              8))();
                }
              }
              std::
              unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             *)&policies[0].mFlags);
              pvVar9 = nlohmann::
                       basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
                       ::operator[]<char_const>
                                 ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
                                   *)&json,"0x0000000000000001");
              pvVar9 = nlohmann::
                       basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
                       ::operator[]<char_const>
                                 ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
                                   *)pvVar9,"PanId");
              nlohmann::
              basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
              ::
              get<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                        ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &gtest_ar_1,pvVar9);
              testing::internal::CmpHelperSTREQ
                        ((internal *)policies,"\"0x0001\"",
                         "json[\"0x0000000000000001\"][\"PanId\"].get<std::string>().c_str()",
                         "0x0001",(char *)gtest_ar_1._0_8_);
              std::__cxx11::string::~string((string *)&gtest_ar_1);
              if ((char)policies[0].mRotationTime == '\0') {
                testing::Message::Message((Message *)&gtest_ar_1);
                if (policies[0].mFlags.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start == (pointer)0x0) {
                  pcVar13 = "";
                }
                else {
                  pcVar13 = *(char **)policies[0].mFlags.
                                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                      ._M_impl.super__Vector_impl_data._M_start;
                }
                testing::internal::AssertHelper::AssertHelper
                          ((AssertHelper *)&converted,kNonFatalFailure,
                           "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/cli/job_manager_test.cpp"
                           ,0x2ac,pcVar13);
                testing::internal::AssertHelper::operator=
                          ((AssertHelper *)&converted,(Message *)&gtest_ar_1);
                testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&converted);
                if (gtest_ar_1._0_8_ != 0) {
                  (**(code **)(*(long *)gtest_ar_1._0_8_ + 8))();
                }
              }
              std::
              unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             *)&policies[0].mFlags);
              pvVar9 = nlohmann::
                       basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
                       ::operator[]<char_const>
                                 ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
                                   *)&json,"0x0000000000000002");
              pvVar9 = nlohmann::
                       basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
                       ::operator[]<char_const>
                                 ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
                                   *)pvVar9,"PanId");
              nlohmann::
              basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
              ::
              get<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                        ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &gtest_ar_1,pvVar9);
              testing::internal::CmpHelperSTREQ
                        ((internal *)policies,"\"0x0002\"",
                         "json[\"0x0000000000000002\"][\"PanId\"].get<std::string>().c_str()",
                         "0x0002",(char *)gtest_ar_1._0_8_);
              std::__cxx11::string::~string((string *)&gtest_ar_1);
              if ((char)policies[0].mRotationTime == '\0') {
                testing::Message::Message((Message *)&gtest_ar_1);
                if (policies[0].mFlags.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start == (pointer)0x0) {
                  pcVar13 = "";
                }
                else {
                  pcVar13 = *(char **)policies[0].mFlags.
                                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                      ._M_impl.super__Vector_impl_data._M_start;
                }
                testing::internal::AssertHelper::AssertHelper
                          ((AssertHelper *)&converted,kNonFatalFailure,
                           "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/cli/job_manager_test.cpp"
                           ,0x2ad,pcVar13);
                testing::internal::AssertHelper::operator=
                          ((AssertHelper *)&converted,(Message *)&gtest_ar_1);
                testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&converted);
                if (gtest_ar_1._0_8_ != 0) {
                  (**(code **)(*(long *)gtest_ar_1._0_8_ + 8))();
                }
              }
              std::
              unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             *)&policies[0].mFlags);
              ot::commissioner::JobManager::CleanupJobs(this_00);
              policies[0].mFlags.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
              _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
              policies[0].mFlags.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
              _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
              policies[0].mFlags.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
              policies[1].mFlags.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
              _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
              policies[1].mFlags.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
              _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
              policies[1].mFlags.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
              std::__cxx11::string::string
                        ((string *)&gtest_ar_1,"opdataset",(allocator *)&local_a98);
              std::__cxx11::string::string((string *)(local_9f0 + 8),"set",(allocator *)&local_a78);
              std::__cxx11::string::string(local_9c8,"securitypolicy",(allocator *)&local_a18);
              std::__cxx11::string::string(local_9a8,"3",&local_b3d);
              std::__cxx11::string::string(local_988,"AB",&local_b3a);
              __l_12._M_len = 5;
              __l_12._M_array = (iterator)&gtest_ar_1;
              std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)&converted_2,__l_12,(allocator_type *)&local_b3b);
              local_a58 = (undefined1  [8])0x1;
              MStack_a50._vptr_MatcherBase = (_func_int **)0x2;
              __l_13._M_len = 2;
              __l_13._M_array = (iterator)local_a58;
              std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
                        ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&gtest_ar_12,
                         __l_13,(allocator_type *)&local_b3c);
              ot::commissioner::JobManager::PrepareJobs
                        ((Error *)&converted,this_00,(Expression *)&converted_2,
                         (vector<unsigned_long,_std::allocator<unsigned_long>_> *)&gtest_ar_12,false
                        );
              local_a38._M_unused._M_member_pointer =
                   local_a38._M_unused._M_member_pointer & 0xffffffff00000000;
              testing::internal::
              CmpHelperEQ<ot::commissioner::ErrorCode,ot::commissioner::ErrorCode>
                        ((internal *)&gtest_ar_13,
                         "ctx.mJobManager.PrepareJobs({\"opdataset\", \"set\", \"securitypolicy\", \"3\", \"AB\"}, {0x1, 0x2}, false).mCode"
                         ,"ErrorCode::kNone",(ErrorCode *)&converted,
                         (ErrorCode *)local_a38._M_pod_data);
              std::__cxx11::string::~string
                        ((string *)(converted.fun_.super__Function_base._M_functor._M_pod_data + 8))
              ;
              std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
                        ((_Vector_base<unsigned_long,_std::allocator<unsigned_long>_> *)&gtest_ar_12
                        );
              std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)&converted_2);
              lVar16 = 0x80;
              do {
                std::__cxx11::string::~string((string *)(&gtest_ar_1.success_ + lVar16));
                lVar16 = lVar16 + -0x20;
              } while (lVar16 != -0x20);
              if (gtest_ar_13.success_ == false) {
                testing::Message::Message((Message *)&gtest_ar_1);
                if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     )gtest_ar_13.message_._M_t.
                      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      .
                      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                      ._M_head_impl ==
                    (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     )0x0) {
                  pcVar13 = "";
                }
                else {
                  pcVar13 = *(char **)gtest_ar_13.message_._M_t.
                                      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      ._M_t.
                                      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      .
                                      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                      ._M_head_impl;
                }
                testing::internal::AssertHelper::AssertHelper
                          ((AssertHelper *)&converted,kNonFatalFailure,
                           "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/cli/job_manager_test.cpp"
                           ,0x2b3,pcVar13);
                testing::internal::AssertHelper::operator=
                          ((AssertHelper *)&converted,(Message *)&gtest_ar_1);
                testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&converted);
                if (gtest_ar_1._0_8_ != 0) {
                  (**(code **)(*(long *)gtest_ar_1._0_8_ + 8))();
                }
              }
              std::
              unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::~unique_ptr(&gtest_ar_13.message_);
              pCVar5 = (CommissionerAppMock *)
                       CONCAT71(commissionerAppMocks[0].
                                super___shared_ptr<CommissionerAppMock,_(__gnu_cxx::_Lock_policy)2>.
                                _M_ptr._1_7_,
                                (char)commissionerAppMocks[0].
                                      super___shared_ptr<CommissionerAppMock,_(__gnu_cxx::_Lock_policy)2>
                                      ._M_ptr);
              testing::A<ot::commissioner::SecurityPolicy_const&>();
              CommissionerAppMock::gmock_SetSecurityPolicy
                        ((MockSpec<ot::commissioner::Error_(const_ot::commissioner::SecurityPolicy_&)>
                          *)local_a58,pCVar5,
                         (Matcher<const_ot::commissioner::SecurityPolicy_&> *)&local_a98);
              testing::internal::GetWithoutMatchers();
              pTVar12 = testing::internal::
                        MockSpec<ot::commissioner::Error_(const_ot::commissioner::SecurityPolicy_&)>
                        ::InternalExpectedAt
                                  ((MockSpec<ot::commissioner::Error_(const_ot::commissioner::SecurityPolicy_&)>
                                    *)local_a58,
                                   "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/cli/job_manager_test.cpp"
                                   ,0x2b4,"*commissionerAppMocks[0]","SetSecurityPolicy(_)");
              local_560._0_4_ = kNone;
              local_558._M_p = local_550 + 8;
              local_550 = (undefined1  [8])0x0;
              local_548._M_local_buf[0] = '\0';
              testing::Return<ot::commissioner::Error>((testing *)&local_a18,(Error *)local_560);
              std::__shared_ptr<ot::commissioner::Error,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                        ((__shared_ptr<ot::commissioner::Error,_(__gnu_cxx::_Lock_policy)2> *)
                         &local_a78,&local_a18);
              converted.fun_.super__Function_base._M_manager = (_Manager_type)0x0;
              converted_2.fun_.super__Function_base._M_functor._8_8_ = 0;
              converted.fun_.super__Function_base._M_functor._M_unused._M_object = (void *)0x0;
              converted.fun_.super__Function_base._M_functor._8_8_ = 0;
              converted.fun_._M_invoker = (_Invoker_type)0x0;
              converted_2.fun_.super__Function_base._M_manager =
                   std::
                   _Function_handler<void_(const_ot::commissioner::SecurityPolicy_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/cli/job_manager_test.cpp:693:37)>
                   ::_M_manager;
              converted_2.fun_._M_invoker =
                   std::
                   _Function_handler<void_(const_ot::commissioner::SecurityPolicy_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/cli/job_manager_test.cpp:693:37)>
                   ::_M_invoke;
              converted_2.fun_.super__Function_base._M_functor._M_unused._M_object =
                   (_Base_ptr)policies;
              local_a78._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)policies;
              std::_Function_base::~_Function_base((_Function_base *)&converted);
              std::function<void_(const_ot::commissioner::SecurityPolicy_&)>::function
                        ((function<void_(const_ot::commissioner::SecurityPolicy_&)> *)&gtest_ar_12,
                         (function<void_(const_ot::commissioner::SecurityPolicy_&)> *)&converted_2);
              gtest_ar_13.success_ = false;
              gtest_ar_13._1_7_ = 0;
              gtest_ar_13.message_._M_t.
              super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_t.
              super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              .
              super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
              ._M_head_impl =
                   (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
                    )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      )0x0;
              converted.fun_.super__Function_base._M_manager = (_Manager_type)0x0;
              converted.fun_._M_invoker = (_Invoker_type)0x0;
              converted.fun_.super__Function_base._M_functor._M_unused._M_object = (void *)0x0;
              converted.fun_.super__Function_base._M_functor._8_8_ = 0;
              gtest_ar_13._0_8_ = operator_new(0x20);
              *(undefined8 *)gtest_ar_13._0_8_ = 0;
              *(undefined8 *)(gtest_ar_13._0_8_ + 8) = 0;
              *(undefined8 *)(gtest_ar_13._0_8_ + 0x10) = 0;
              *(undefined8 *)(gtest_ar_13._0_8_ + 0x18) = 0;
              gtest_ar_13.message_._M_t.
              super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_t.
              super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              .
              super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
              ._M_head_impl =
                   (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
                    )(__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
                      )converted.fun_.super__Function_base._M_functor._8_8_;
              converted.fun_.super__Function_base._M_manager = (_Manager_type)0x0;
              converted.fun_._M_invoker = (_Invoker_type)0x0;
              converted.fun_.super__Function_base._M_functor._M_unused._M_object = (void *)0x0;
              converted.fun_.super__Function_base._M_functor._8_8_ = 0;
              std::_Function_base::~_Function_base((_Function_base *)&converted);
              std::_Function_base::~_Function_base((_Function_base *)&gtest_ar_12);
              std::_Function_base::~_Function_base((_Function_base *)&converted_2);
              __l_14._M_len = 1;
              __l_14._M_array = (iterator)&gtest_ar_13;
              std::
              vector<testing::Action<void_(const_ot::commissioner::SecurityPolicy_&)>,_std::allocator<testing::Action<void_(const_ot::commissioner::SecurityPolicy_&)>_>_>
              ::vector((vector<testing::Action<void_(const_ot::commissioner::SecurityPolicy_&)>,_std::allocator<testing::Action<void_(const_ot::commissioner::SecurityPolicy_&)>_>_>
                        *)&gtest_ar_1,__l_14,(allocator_type *)&converted);
              std::_Function_base::~_Function_base((_Function_base *)&gtest_ar_13);
              testing::internal::ReturnAction::operator_cast_to_Action
                        ((Action<ot::commissioner::Error_(const_ot::commissioner::SecurityPolicy_&)>
                          *)local_9f0,(ReturnAction *)&local_a78);
              local_a28 = (code *)0x0;
              pcStack_a20 = (code *)0x0;
              local_a38._M_unused._M_object = (void *)0x0;
              local_a38._8_8_ = 0;
              converted.fun_.super__Function_base._M_manager = (_Manager_type)0x0;
              converted.fun_._M_invoker = (_Invoker_type)0x0;
              converted.fun_.super__Function_base._M_functor._M_unused._M_object = (void *)0x0;
              converted.fun_.super__Function_base._M_functor._8_8_ = 0;
              local_a38._M_unused._M_object = operator_new(0x38);
              *(undefined8 *)local_a38._M_unused._0_8_ = gtest_ar_1._0_8_;
              ((__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
                *)((long)local_a38._M_unused._0_8_ + 8))->
              super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   = (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      )gtest_ar_1.message_._M_t.
                       super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       .
                       super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                       ._M_head_impl;
              *(undefined8 *)((long)local_a38._M_unused._0_8_ + 0x10) = 0;
              gtest_ar_1.success_ = false;
              gtest_ar_1._1_7_ = 0;
              gtest_ar_1.message_._M_t.
              super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_t.
              super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              .
              super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
              ._M_head_impl =
                   (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
                    )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      )0x0;
              *(undefined8 *)((long)local_a38._M_unused._0_8_ + 0x18) = 0;
              *(undefined8 *)((long)local_a38._M_unused._0_8_ + 0x20) = 0;
              *(undefined8 *)((long)local_a38._M_unused._0_8_ + 0x28) = 0;
              *(undefined8 *)((long)local_a38._M_unused._0_8_ + 0x30) = local_9e0._8_8_;
              if (local_9e0._M_allocated_capacity != 0) {
                *(undefined8 *)((long)local_a38._M_unused._0_8_ + 0x18) = local_9f0._0_8_;
                *(undefined8 *)((long)local_a38._M_unused._0_8_ + 0x20) = local_9f0._8_8_;
                *(size_type *)((long)local_a38._M_unused._0_8_ + 0x28) =
                     local_9e0._M_allocated_capacity;
                local_9e0._M_allocated_capacity = 0;
                local_9e0._8_4_ = 0;
                local_9e0._12_2_ = 0;
                local_9e0._14_2_ = 0;
              }
              local_a38._8_8_ = converted.fun_.super__Function_base._M_functor._8_8_;
              converted.fun_.super__Function_base._M_manager = (_Manager_type)0x0;
              converted.fun_._M_invoker = (_Invoker_type)0x0;
              converted.fun_.super__Function_base._M_functor._M_unused._M_object = (void *)0x0;
              converted.fun_.super__Function_base._M_functor._8_8_ = 0;
              local_a28 = std::_Function_handler::operator_cast_to_Action;
              pcStack_a20 = std::_Function_handler::operator_cast_to_Action;
              std::_Function_base::~_Function_base((_Function_base *)&converted);
              anon_func::Op::~Op((Op *)&gtest_ar_1);
              testing::internal::
              TypedExpectation<ot::commissioner::Error_(const_ot::commissioner::SecurityPolicy_&)>::
              WillOnce(pTVar12,(Action<ot::commissioner::Error_(const_ot::commissioner::SecurityPolicy_&)>
                                *)&local_a38);
              std::_Function_base::~_Function_base((_Function_base *)&local_a38);
              std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                        ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
                         &local_a78._M_impl.super__Vector_impl_data._M_finish);
              std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                        (&local_a18._M_refcount);
              std::__cxx11::string::~string((string *)&local_558);
              testing::internal::MatcherBase<const_ot::commissioner::SecurityPolicy_&>::~MatcherBase
                        ((MatcherBase<const_ot::commissioner::SecurityPolicy_&> *)(local_a58 + 8));
              testing::internal::MatcherBase<const_ot::commissioner::SecurityPolicy_&>::~MatcherBase
                        ((MatcherBase<const_ot::commissioner::SecurityPolicy_&> *)&local_a98);
              peVar1 = commissionerAppMocks[1].
                       super___shared_ptr<CommissionerAppMock,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
              testing::A<ot::commissioner::SecurityPolicy_const&>();
              CommissionerAppMock::gmock_SetSecurityPolicy
                        ((MockSpec<ot::commissioner::Error_(const_ot::commissioner::SecurityPolicy_&)>
                          *)local_a58,peVar1,
                         (Matcher<const_ot::commissioner::SecurityPolicy_&> *)&local_a98);
              testing::internal::GetWithoutMatchers();
              pTVar12 = testing::internal::
                        MockSpec<ot::commissioner::Error_(const_ot::commissioner::SecurityPolicy_&)>
                        ::InternalExpectedAt
                                  ((MockSpec<ot::commissioner::Error_(const_ot::commissioner::SecurityPolicy_&)>
                                    *)local_a58,
                                   "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/cli/job_manager_test.cpp"
                                   ,0x2b6,"*commissionerAppMocks[1]","SetSecurityPolicy(_)");
              local_588._0_4_ = kNone;
              local_580._M_p = (pointer)&local_570;
              local_578 = (pointer)0x0;
              local_570._M_local_buf[0] = '\0';
              testing::Return<ot::commissioner::Error>((testing *)&local_a18,(Error *)local_588);
              std::__shared_ptr<ot::commissioner::Error,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                        ((__shared_ptr<ot::commissioner::Error,_(__gnu_cxx::_Lock_policy)2> *)
                         &local_a78,&local_a18);
              converted.fun_.super__Function_base._M_manager = (_Manager_type)0x0;
              converted_2.fun_.super__Function_base._M_functor._8_8_ = 0;
              converted.fun_.super__Function_base._M_functor._M_unused._M_object = (void *)0x0;
              converted.fun_.super__Function_base._M_functor._8_8_ = 0;
              converted.fun_._M_invoker = (_Invoker_type)0x0;
              converted_2.fun_.super__Function_base._M_manager =
                   std::
                   _Function_handler<void_(const_ot::commissioner::SecurityPolicy_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/cli/job_manager_test.cpp:695:37)>
                   ::_M_manager;
              converted_2.fun_._M_invoker =
                   std::
                   _Function_handler<void_(const_ot::commissioner::SecurityPolicy_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/cli/job_manager_test.cpp:695:37)>
                   ::_M_invoke;
              converted_2.fun_.super__Function_base._M_functor._M_unused._M_object =
                   (_Base_ptr)policies;
              local_a78._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)policies;
              std::_Function_base::~_Function_base((_Function_base *)&converted);
              std::function<void_(const_ot::commissioner::SecurityPolicy_&)>::function
                        ((function<void_(const_ot::commissioner::SecurityPolicy_&)> *)&gtest_ar_12,
                         (function<void_(const_ot::commissioner::SecurityPolicy_&)> *)&converted_2);
              gtest_ar_13.success_ = false;
              gtest_ar_13._1_7_ = 0;
              gtest_ar_13.message_._M_t.
              super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_t.
              super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              .
              super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
              ._M_head_impl =
                   (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
                    )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      )0x0;
              converted.fun_.super__Function_base._M_manager = (_Manager_type)0x0;
              converted.fun_._M_invoker = (_Invoker_type)0x0;
              converted.fun_.super__Function_base._M_functor._M_unused._M_object = (void *)0x0;
              converted.fun_.super__Function_base._M_functor._8_8_ = 0;
              gtest_ar_13._0_8_ = operator_new(0x20);
              *(undefined8 *)gtest_ar_13._0_8_ = 0;
              *(undefined8 *)(gtest_ar_13._0_8_ + 8) = 0;
              *(undefined8 *)(gtest_ar_13._0_8_ + 0x10) = 0;
              *(undefined8 *)(gtest_ar_13._0_8_ + 0x18) = 0;
              gtest_ar_13.message_._M_t.
              super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_t.
              super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              .
              super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
              ._M_head_impl =
                   (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
                    )(__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
                      )converted.fun_.super__Function_base._M_functor._8_8_;
              converted.fun_.super__Function_base._M_manager = (_Manager_type)0x0;
              converted.fun_._M_invoker = (_Invoker_type)0x0;
              converted.fun_.super__Function_base._M_functor._M_unused._M_object = (void *)0x0;
              converted.fun_.super__Function_base._M_functor._8_8_ = 0;
              std::_Function_base::~_Function_base((_Function_base *)&converted);
              std::_Function_base::~_Function_base((_Function_base *)&gtest_ar_12);
              std::_Function_base::~_Function_base((_Function_base *)&converted_2);
              __l_15._M_len = 1;
              __l_15._M_array = (iterator)&gtest_ar_13;
              std::
              vector<testing::Action<void_(const_ot::commissioner::SecurityPolicy_&)>,_std::allocator<testing::Action<void_(const_ot::commissioner::SecurityPolicy_&)>_>_>
              ::vector((vector<testing::Action<void_(const_ot::commissioner::SecurityPolicy_&)>,_std::allocator<testing::Action<void_(const_ot::commissioner::SecurityPolicy_&)>_>_>
                        *)&gtest_ar_1,__l_15,(allocator_type *)&converted);
              std::_Function_base::~_Function_base((_Function_base *)&gtest_ar_13);
              testing::internal::ReturnAction::operator_cast_to_Action
                        ((Action<ot::commissioner::Error_(const_ot::commissioner::SecurityPolicy_&)>
                          *)local_9f0,(ReturnAction *)&local_a78);
              local_a28 = (code *)0x0;
              pcStack_a20 = (code *)0x0;
              local_a38._M_unused._M_object = (void *)0x0;
              local_a38._8_8_ = 0;
              converted.fun_.super__Function_base._M_manager = (_Manager_type)0x0;
              converted.fun_._M_invoker = (_Invoker_type)0x0;
              converted.fun_.super__Function_base._M_functor._M_unused._M_object = (void *)0x0;
              converted.fun_.super__Function_base._M_functor._8_8_ = 0;
              local_a38._M_unused._M_object = operator_new(0x38);
              *(undefined8 *)local_a38._M_unused._0_8_ = gtest_ar_1._0_8_;
              ((__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
                *)((long)local_a38._M_unused._0_8_ + 8))->
              super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   = (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      )gtest_ar_1.message_._M_t.
                       super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       .
                       super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                       ._M_head_impl;
              *(undefined8 *)((long)local_a38._M_unused._0_8_ + 0x10) = 0;
              gtest_ar_1.success_ = false;
              gtest_ar_1._1_7_ = 0;
              gtest_ar_1.message_._M_t.
              super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_t.
              super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              .
              super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
              ._M_head_impl =
                   (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
                    )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      )0x0;
              *(undefined8 *)((long)local_a38._M_unused._0_8_ + 0x18) = 0;
              *(undefined8 *)((long)local_a38._M_unused._0_8_ + 0x20) = 0;
              *(undefined8 *)((long)local_a38._M_unused._0_8_ + 0x28) = 0;
              *(undefined8 *)((long)local_a38._M_unused._0_8_ + 0x30) = local_9e0._8_8_;
              if (local_9e0._M_allocated_capacity != 0) {
                *(undefined8 *)((long)local_a38._M_unused._0_8_ + 0x18) = local_9f0._0_8_;
                *(undefined8 *)((long)local_a38._M_unused._0_8_ + 0x20) = local_9f0._8_8_;
                *(size_type *)((long)local_a38._M_unused._0_8_ + 0x28) =
                     local_9e0._M_allocated_capacity;
                local_9e0._M_allocated_capacity = 0;
                local_9e0._8_4_ = 0;
                local_9e0._12_2_ = 0;
                local_9e0._14_2_ = 0;
              }
              local_a38._8_8_ = converted.fun_.super__Function_base._M_functor._8_8_;
              converted.fun_.super__Function_base._M_manager = (_Manager_type)0x0;
              converted.fun_._M_invoker = (_Invoker_type)0x0;
              converted.fun_.super__Function_base._M_functor._M_unused._M_object = (void *)0x0;
              converted.fun_.super__Function_base._M_functor._8_8_ = 0;
              local_a28 = std::_Function_handler::operator_cast_to_Action;
              pcStack_a20 = std::_Function_handler::operator_cast_to_Action;
              std::_Function_base::~_Function_base((_Function_base *)&converted);
              anon_func::Op::~Op((Op *)&gtest_ar_1);
              testing::internal::
              TypedExpectation<ot::commissioner::Error_(const_ot::commissioner::SecurityPolicy_&)>::
              WillOnce(pTVar12,(Action<ot::commissioner::Error_(const_ot::commissioner::SecurityPolicy_&)>
                                *)&local_a38);
              std::_Function_base::~_Function_base((_Function_base *)&local_a38);
              std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                        ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
                         &local_a78._M_impl.super__Vector_impl_data._M_finish);
              std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                        (&local_a18._M_refcount);
              std::__cxx11::string::~string((string *)&local_580);
              testing::internal::MatcherBase<const_ot::commissioner::SecurityPolicy_&>::~MatcherBase
                        ((MatcherBase<const_ot::commissioner::SecurityPolicy_&> *)(local_a58 + 8));
              testing::internal::MatcherBase<const_ot::commissioner::SecurityPolicy_&>::~MatcherBase
                        ((MatcherBase<const_ot::commissioner::SecurityPolicy_&> *)&local_a98);
              ot::commissioner::JobManager::RunJobs(this_00);
              ot::commissioner::JobManager::CollectJobsValue((Value *)&gtest_ar_1,this_00);
              ot::commissioner::Interpreter::Value::operator=(&value,(Value *)&gtest_ar_1);
              ot::commissioner::Interpreter::Value::~Value((Value *)&gtest_ar_1);
              ot::commissioner::Interpreter::Value::ToString_abi_cxx11_
                        ((string *)&gtest_ar_1,&value);
              nlohmann::detail::input_adapter::
              input_adapter<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                        ((input_adapter *)&converted,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &gtest_ar_1);
              local_618 = (pointer)0x0;
              pp_Stack_610 = (_func_int **)0x0;
              local_628._M_unused._M_object = (pointer)0x0;
              local_628._8_8_ = (pointer)0x0;
              nlohmann::
              basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
              ::parse(&local_688,(input_adapter *)&converted,(parser_callback_t *)&local_628,true);
              nlohmann::
              basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
              ::operator=(&json,&local_688);
              nlohmann::
              basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
              ::~basic_json(&local_688);
              std::_Function_base::~_Function_base((_Function_base *)&local_628);
              std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                        ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
                         ((long)&converted.fun_.super__Function_base._M_functor + 8));
              std::__cxx11::string::~string((string *)&gtest_ar_1);
              bVar3 = nlohmann::
                      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                      ::contains<const_char_(&)[19],_0>(&json,(char (*) [19])"0x0000000000000001");
              converted.fun_.super__Function_base._M_functor._M_pod_data[0] = bVar3;
              converted.fun_.super__Function_base._M_functor._8_8_ = 0;
              if (!bVar3) {
                testing::Message::Message((Message *)&converted_2);
                testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                          ((string *)&gtest_ar_1,(internal *)&converted,
                           (AssertionResult *)"json.contains(\"0x0000000000000001\")","false","true"
                           ,pcVar14);
                testing::internal::AssertHelper::AssertHelper
                          ((AssertHelper *)&gtest_ar_12,kNonFatalFailure,
                           "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/cli/job_manager_test.cpp"
                           ,699,(char *)gtest_ar_1._0_8_);
                testing::internal::AssertHelper::operator=
                          ((AssertHelper *)&gtest_ar_12,(Message *)&converted_2);
                testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_12);
                std::__cxx11::string::~string((string *)&gtest_ar_1);
                if (converted_2.fun_.super__Function_base._M_functor._M_unused._M_object !=
                    (void *)0x0) {
                  (**(code **)(*converted_2.fun_.super__Function_base._M_functor._M_unused._M_object
                              + 8))();
                }
              }
              std::
              unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             *)((long)&converted.fun_.super__Function_base._M_functor + 8));
              bVar3 = nlohmann::
                      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                      ::contains<const_char_(&)[19],_0>(&json,(char (*) [19])"0x0000000000000002");
              converted.fun_.super__Function_base._M_functor._M_pod_data[0] = bVar3;
              converted.fun_.super__Function_base._M_functor._8_8_ = 0;
              if (!bVar3) {
                testing::Message::Message((Message *)&converted_2);
                testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                          ((string *)&gtest_ar_1,(internal *)&converted,
                           (AssertionResult *)"json.contains(\"0x0000000000000002\")","false","true"
                           ,pcVar14);
                testing::internal::AssertHelper::AssertHelper
                          ((AssertHelper *)&gtest_ar_12,kNonFatalFailure,
                           "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/cli/job_manager_test.cpp"
                           ,700,(char *)gtest_ar_1._0_8_);
                testing::internal::AssertHelper::operator=
                          ((AssertHelper *)&gtest_ar_12,(Message *)&converted_2);
                testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_12);
                std::__cxx11::string::~string((string *)&gtest_ar_1);
                if (converted_2.fun_.super__Function_base._M_functor._M_unused._M_object !=
                    (void *)0x0) {
                  (**(code **)(*converted_2.fun_.super__Function_base._M_functor._M_unused._M_object
                              + 8))();
                }
              }
              std::
              unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             *)((long)&converted.fun_.super__Function_base._M_functor + 8));
              pvVar9 = nlohmann::
                       basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
                       ::operator[]<char_const>
                                 ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
                                   *)&json,"0x0000000000000001");
              bVar3 = nlohmann::
                      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                      ::get<bool,_bool,_0>(pvVar9);
              converted.fun_.super__Function_base._M_functor._M_pod_data[0] = bVar3;
              converted.fun_.super__Function_base._M_functor._8_8_ = 0;
              if (!bVar3) {
                testing::Message::Message((Message *)&converted_2);
                testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                          ((string *)&gtest_ar_1,(internal *)&converted,
                           (AssertionResult *)"json[\"0x0000000000000001\"]","false","true",pcVar14)
                ;
                testing::internal::AssertHelper::AssertHelper
                          ((AssertHelper *)&gtest_ar_12,kNonFatalFailure,
                           "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/cli/job_manager_test.cpp"
                           ,0x2bd,(char *)gtest_ar_1._0_8_);
                testing::internal::AssertHelper::operator=
                          ((AssertHelper *)&gtest_ar_12,(Message *)&converted_2);
                testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_12);
                std::__cxx11::string::~string((string *)&gtest_ar_1);
                if (converted_2.fun_.super__Function_base._M_functor._M_unused._M_object !=
                    (void *)0x0) {
                  (**(code **)(*converted_2.fun_.super__Function_base._M_functor._M_unused._M_object
                              + 8))();
                }
              }
              std::
              unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             *)((long)&converted.fun_.super__Function_base._M_functor + 8));
              pvVar9 = nlohmann::
                       basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
                       ::operator[]<char_const>
                                 ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
                                   *)&json,"0x0000000000000002");
              bVar3 = nlohmann::
                      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                      ::get<bool,_bool,_0>(pvVar9);
              converted.fun_.super__Function_base._M_functor._M_pod_data[0] = bVar3;
              converted.fun_.super__Function_base._M_functor._8_8_ = 0;
              if (!bVar3) {
                testing::Message::Message((Message *)&converted_2);
                testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                          ((string *)&gtest_ar_1,(internal *)&converted,
                           (AssertionResult *)"json[\"0x0000000000000002\"]","false","true",pcVar14)
                ;
                testing::internal::AssertHelper::AssertHelper
                          ((AssertHelper *)&gtest_ar_12,kNonFatalFailure,
                           "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/cli/job_manager_test.cpp"
                           ,0x2be,(char *)gtest_ar_1._0_8_);
                testing::internal::AssertHelper::operator=
                          ((AssertHelper *)&gtest_ar_12,(Message *)&converted_2);
                testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_12);
                std::__cxx11::string::~string((string *)&gtest_ar_1);
                if (converted_2.fun_.super__Function_base._M_functor._M_unused._M_object !=
                    (void *)0x0) {
                  (**(code **)(*converted_2.fun_.super__Function_base._M_functor._M_unused._M_object
                              + 8))();
                }
              }
              std::
              unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             *)((long)&converted.fun_.super__Function_base._M_functor + 8));
              ot::commissioner::JobManager::CleanupJobs(this_00);
              std::__cxx11::string::string((string *)&converted,"stop",(allocator *)&local_a98);
              __l_16._M_len = 1;
              __l_16._M_array = (iterator)&converted;
              std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)&converted_2,__l_16,(allocator_type *)&local_a78);
              local_a58 = (undefined1  [8])0x1;
              MStack_a50._vptr_MatcherBase = (_func_int **)0x2;
              __l_17._M_len = 2;
              __l_17._M_array = (iterator)local_a58;
              std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
                        ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&gtest_ar_12,
                         __l_17,(allocator_type *)&local_a18);
              ot::commissioner::JobManager::PrepareJobs
                        ((Error *)&gtest_ar_1,this_00,(Expression *)&converted_2,
                         (vector<unsigned_long,_std::allocator<unsigned_long>_> *)&gtest_ar_12,false
                        );
              local_a38._M_unused._M_member_pointer =
                   local_a38._M_unused._M_member_pointer & 0xffffffff00000000;
              pcVar13 = "ctx.mJobManager.PrepareJobs({\"stop\"}, {0x1, 0x2}, false).mCode";
              testing::internal::
              CmpHelperEQ<ot::commissioner::ErrorCode,ot::commissioner::ErrorCode>
                        ((internal *)&gtest_ar_13,
                         "ctx.mJobManager.PrepareJobs({\"stop\"}, {0x1, 0x2}, false).mCode",
                         "ErrorCode::kNone",(ErrorCode *)&gtest_ar_1,
                         (ErrorCode *)local_a38._M_pod_data);
              std::__cxx11::string::~string((string *)&gtest_ar_1.message_);
              std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
                        ((_Vector_base<unsigned_long,_std::allocator<unsigned_long>_> *)&gtest_ar_12
                        );
              std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)&converted_2);
              std::__cxx11::string::~string((string *)&converted);
              if (gtest_ar_13.success_ == false) {
                testing::Message::Message((Message *)&gtest_ar_1);
                if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     )gtest_ar_13.message_._M_t.
                      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      .
                      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                      ._M_head_impl ==
                    (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     )0x0) {
                  pcVar13 = "";
                }
                else {
                  pcVar13 = *(char **)gtest_ar_13.message_._M_t.
                                      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      ._M_t.
                                      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      .
                                      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                      ._M_head_impl;
                }
                testing::internal::AssertHelper::AssertHelper
                          ((AssertHelper *)&converted,kNonFatalFailure,
                           "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/cli/job_manager_test.cpp"
                           ,0x2c2,pcVar13);
                pcVar13 = &gtest_ar_1.success_;
                testing::internal::AssertHelper::operator=
                          ((AssertHelper *)&converted,(Message *)pcVar13);
                testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&converted);
                if (gtest_ar_1._0_8_ != 0) {
                  (**(code **)(*(long *)gtest_ar_1._0_8_ + 8))();
                }
              }
              std::
              unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::~unique_ptr(&gtest_ar_13.message_);
              gtest_ar_1._0_8_ =
                   CommissionerAppMock::gmock_Stop
                             ((MockSpec<void_()> *)
                              CONCAT71(commissionerAppMocks[0].
                                       super___shared_ptr<CommissionerAppMock,_(__gnu_cxx::_Lock_policy)2>
                                       ._M_ptr._1_7_,
                                       (char)commissionerAppMocks[0].
                                             super___shared_ptr<CommissionerAppMock,_(__gnu_cxx::_Lock_policy)2>
                                             ._M_ptr),(CommissionerAppMock *)pcVar13);
              testing::internal::GetWithoutMatchers();
              pcVar13 = 
              "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/cli/job_manager_test.cpp"
              ;
              testing::internal::MockSpec<void_()>::InternalExpectedAt
                        ((MockSpec<void_()> *)&gtest_ar_1,
                         "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/cli/job_manager_test.cpp"
                         ,0x2c3,"*commissionerAppMocks[0]","Stop()");
              gtest_ar_1._0_8_ =
                   CommissionerAppMock::gmock_Stop
                             ((MockSpec<void_()> *)
                              commissionerAppMocks[1].
                              super___shared_ptr<CommissionerAppMock,_(__gnu_cxx::_Lock_policy)2>.
                              _M_ptr,(CommissionerAppMock *)pcVar13);
              testing::internal::GetWithoutMatchers();
              testing::internal::MockSpec<void_()>::InternalExpectedAt
                        ((MockSpec<void_()> *)&gtest_ar_1,
                         "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/cli/job_manager_test.cpp"
                         ,0x2c4,"*commissionerAppMocks[1]","Stop()");
              ot::commissioner::JobManager::RunJobs(this_00);
              ot::commissioner::JobManager::CollectJobsValue((Value *)&gtest_ar_1,this_00);
              ot::commissioner::Interpreter::Value::operator=(&value,(Value *)&gtest_ar_1);
              ot::commissioner::Interpreter::Value::~Value((Value *)&gtest_ar_1);
              ot::commissioner::Interpreter::Value::ToString_abi_cxx11_
                        ((string *)&gtest_ar_1,&value);
              nlohmann::detail::input_adapter::
              input_adapter<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                        ((input_adapter *)&converted,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &gtest_ar_1);
              local_638 = (pointer)0x0;
              pp_Stack_630 = (_func_int **)0x0;
              local_648._M_unused._M_object = (pointer)0x0;
              local_648._8_8_ = (pointer)0x0;
              nlohmann::
              basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
              ::parse(&local_698,(input_adapter *)&converted,(parser_callback_t *)&local_648,true);
              nlohmann::
              basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
              ::operator=(&json,&local_698);
              nlohmann::
              basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
              ::~basic_json(&local_698);
              std::_Function_base::~_Function_base((_Function_base *)&local_648);
              std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                        ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
                         ((long)&converted.fun_.super__Function_base._M_functor + 8));
              std::__cxx11::string::~string((string *)&gtest_ar_1);
              bVar3 = nlohmann::
                      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                      ::contains<const_char_(&)[19],_0>(&json,(char (*) [19])"0x0000000000000001");
              converted.fun_.super__Function_base._M_functor._M_pod_data[0] = bVar3;
              converted.fun_.super__Function_base._M_functor._8_8_ = 0;
              if (!bVar3) {
                testing::Message::Message((Message *)&converted_2);
                testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                          ((string *)&gtest_ar_1,(internal *)&converted,
                           (AssertionResult *)"json.contains(\"0x0000000000000001\")","false","true"
                           ,pcVar14);
                testing::internal::AssertHelper::AssertHelper
                          ((AssertHelper *)&gtest_ar_12,kNonFatalFailure,
                           "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/cli/job_manager_test.cpp"
                           ,0x2c8,(char *)gtest_ar_1._0_8_);
                testing::internal::AssertHelper::operator=
                          ((AssertHelper *)&gtest_ar_12,(Message *)&converted_2);
                testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_12);
                std::__cxx11::string::~string((string *)&gtest_ar_1);
                if (converted_2.fun_.super__Function_base._M_functor._M_unused._M_object !=
                    (void *)0x0) {
                  (**(code **)(*converted_2.fun_.super__Function_base._M_functor._M_unused._M_object
                              + 8))();
                }
              }
              std::
              unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             *)((long)&converted.fun_.super__Function_base._M_functor + 8));
              bVar3 = nlohmann::
                      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                      ::contains<const_char_(&)[19],_0>(&json,(char (*) [19])"0x0000000000000002");
              converted.fun_.super__Function_base._M_functor._M_pod_data[0] = bVar3;
              converted.fun_.super__Function_base._M_functor._8_8_ = 0;
              if (!bVar3) {
                testing::Message::Message((Message *)&converted_2);
                testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                          ((string *)&gtest_ar_1,(internal *)&converted,
                           (AssertionResult *)"json.contains(\"0x0000000000000002\")","false","true"
                           ,pcVar14);
                testing::internal::AssertHelper::AssertHelper
                          ((AssertHelper *)&gtest_ar_12,kNonFatalFailure,
                           "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/cli/job_manager_test.cpp"
                           ,0x2c9,(char *)gtest_ar_1._0_8_);
                testing::internal::AssertHelper::operator=
                          ((AssertHelper *)&gtest_ar_12,(Message *)&converted_2);
                testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_12);
                std::__cxx11::string::~string((string *)&gtest_ar_1);
                if (converted_2.fun_.super__Function_base._M_functor._M_unused._M_object !=
                    (void *)0x0) {
                  (**(code **)(*converted_2.fun_.super__Function_base._M_functor._M_unused._M_object
                              + 8))();
                }
              }
              std::
              unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             *)((long)&converted.fun_.super__Function_base._M_functor + 8));
              pvVar9 = nlohmann::
                       basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
                       ::operator[]<char_const>
                                 ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
                                   *)&json,"0x0000000000000001");
              bVar3 = nlohmann::
                      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                      ::get<bool,_bool,_0>(pvVar9);
              converted.fun_.super__Function_base._M_functor._M_pod_data[0] = bVar3;
              converted.fun_.super__Function_base._M_functor._8_8_ = 0;
              if (!bVar3) {
                testing::Message::Message((Message *)&converted_2);
                testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                          ((string *)&gtest_ar_1,(internal *)&converted,
                           (AssertionResult *)"json[\"0x0000000000000001\"]","false","true",pcVar14)
                ;
                testing::internal::AssertHelper::AssertHelper
                          ((AssertHelper *)&gtest_ar_12,kNonFatalFailure,
                           "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/cli/job_manager_test.cpp"
                           ,0x2ca,(char *)gtest_ar_1._0_8_);
                testing::internal::AssertHelper::operator=
                          ((AssertHelper *)&gtest_ar_12,(Message *)&converted_2);
                testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_12);
                std::__cxx11::string::~string((string *)&gtest_ar_1);
                if (converted_2.fun_.super__Function_base._M_functor._M_unused._M_object !=
                    (void *)0x0) {
                  (**(code **)(*converted_2.fun_.super__Function_base._M_functor._M_unused._M_object
                              + 8))();
                }
              }
              std::
              unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             *)((long)&converted.fun_.super__Function_base._M_functor + 8));
              pvVar9 = nlohmann::
                       basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
                       ::operator[]<char_const>
                                 ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
                                   *)&json,"0x0000000000000002");
              bVar3 = nlohmann::
                      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                      ::get<bool,_bool,_0>(pvVar9);
              converted.fun_.super__Function_base._M_functor._M_pod_data[0] = bVar3;
              converted.fun_.super__Function_base._M_functor._8_8_ = 0;
              if (!bVar3) {
                testing::Message::Message((Message *)&converted_2);
                testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                          ((string *)&gtest_ar_1,(internal *)&converted,
                           (AssertionResult *)"json[\"0x0000000000000002\"]","false","true",pcVar14)
                ;
                testing::internal::AssertHelper::AssertHelper
                          ((AssertHelper *)&gtest_ar_12,kNonFatalFailure,
                           "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/cli/job_manager_test.cpp"
                           ,0x2cb,(char *)gtest_ar_1._0_8_);
                testing::internal::AssertHelper::operator=
                          ((AssertHelper *)&gtest_ar_12,(Message *)&converted_2);
                testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_12);
                std::__cxx11::string::~string((string *)&gtest_ar_1);
                if (converted_2.fun_.super__Function_base._M_functor._M_unused._M_object !=
                    (void *)0x0) {
                  (**(code **)(*converted_2.fun_.super__Function_base._M_functor._M_unused._M_object
                              + 8))();
                }
              }
              std::
              unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             *)((long)&converted.fun_.super__Function_base._M_functor + 8));
              ot::commissioner::JobManager::CleanupJobs(this_00);
              lVar16 = 0x28;
              do {
                std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                          ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)
                           ((long)&policies[0].mRotationTime + lVar16));
                lVar16 = lVar16 + -0x20;
              } while (lVar16 != -0x18);
              nlohmann::
              basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
              ::~basic_json(&json);
              ot::commissioner::Interpreter::Value::~Value(&value);
              lVar16 = 0x28;
              do {
                std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                          ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
                           ((long)&commissionerAppMocks[0].
                                   super___shared_ptr<CommissionerAppMock,_(__gnu_cxx::_Lock_policy)2>
                                   ._M_ptr + lVar16));
                lVar16 = lVar16 + -0x10;
              } while (lVar16 != -8);
              goto LAB_0012f57c;
            }
            testing::Message::Message((Message *)&gtest_ar_1);
            if (json.m_value.object != (object_t *)0x0) {
              pbVar17 = ((json.m_value.array)->
                        super__Vector_base<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>,_std::allocator<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>_>
                        )._M_impl.super__Vector_impl_data._M_start;
            }
            testing::internal::AssertHelper::AssertHelper
                      ((AssertHelper *)&value,kFatalFailure,
                       "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/cli/job_manager_test.cpp"
                       ,0x256,(char *)pbVar17);
            testing::internal::AssertHelper::operator=
                      ((AssertHelper *)&value,(Message *)&gtest_ar_1);
            this_01 = &json.m_value;
            testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&value);
            if (gtest_ar_1._0_8_ != 0) {
              (**(code **)(*(long *)gtest_ar_1._0_8_ + 8))();
            }
          }
        }
      }
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)this_01);
LAB_0012f57c:
  JobManagerTestSuite::TestContext::~TestContext(&ctx);
  return;
}

Assistant:

TEST_F(JobManagerTestSuite, BuildFinalResultString)
{
    TestContext ctx;
    SetInitialExpectations(ctx);

    // Formally set default PSKc
    ctx.mConf.mPSKc = {'1', '0'};

    using namespace ot::commissioner::persistent_storage;
    // Prepare test data
    NetworkId      nid;
    BorderRouterId rid;

    ASSERT_EQ(ctx.mPS->Add(Network{0, 0, "pan1", 1, 1, 0x1, "", 0}, nid), PersistentStorage::Status::kSuccess);
    EXPECT_EQ(nid.mId, 0);

    ASSERT_EQ(ctx.mPS->Add(BorderRouter{0, nid,
                                        BorderAgent{"127.0.0.1", 20001, ByteArray{}, "1.1",
                                                    BorderAgent::State{0, 0, 0, 0, 0}, "", 0, "", "",
                                                    Timestamp{0, 0, 0}, 0, "", ByteArray{}, "", 0, 0, "", 0, 0x0F}},
                           rid),
              PersistentStorage::Status::kSuccess);
    EXPECT_EQ(rid.mId, 0);

    ASSERT_EQ(ctx.mPS->Add(Network{0, 0, "pan2", 2, 2, 0x2, "", 0}, nid), PersistentStorage::Status::kSuccess);
    EXPECT_EQ(nid.mId, 1);

    ASSERT_EQ(ctx.mPS->Add(BorderRouter{0, nid,
                                        BorderAgent{"127.0.0.1", 20002, ByteArray{}, "1.1",
                                                    BorderAgent::State{0, 0, 0, 0, 0}, "", 0, "", "",
                                                    Timestamp{0, 0, 0}, 0, "", ByteArray{}, "", 0, 0, "", 0, 0x0F}},
                           rid),
              PersistentStorage::Status::kSuccess);
    EXPECT_EQ(rid.mId, 1);

    ASSERT_EQ(ctx.mPS->Add(Network{0, 0, "pan3", 3, 3, 0x3, "", 0}, nid), PersistentStorage::Status::kSuccess);
    EXPECT_EQ(nid.mId, 2);

    ASSERT_EQ(ctx.mPS->Add(BorderRouter{0, nid,
                                        BorderAgent{"127.0.0.1", 20003, ByteArray{}, "1.1",
                                                    BorderAgent::State{0, 0, 0, 0, 0}, "", 0, "", "",
                                                    Timestamp{0, 0, 0}, 0, "", ByteArray{}, "", 0, 0, "", 0, 0x0F}},
                           rid),
              PersistentStorage::Status::kSuccess);
    EXPECT_EQ(rid.mId, 2);

    Init(ctx, ".");

    uint8_t                camIdx                  = 0;
    CommissionerAppMockPtr commissionerAppMocks[3] = {CommissionerAppMockPtr{new CommissionerAppMock()},
                                                      CommissionerAppMockPtr{new CommissionerAppMock()},
                                                      CommissionerAppMockPtr{new CommissionerAppMock()}};

    EXPECT_CALL(ctx.mCommissionerAppStaticExpecter, Create(_, _))
        .Times(3)
        .WillRepeatedly(
            DoAll(WithArg<0>([&](std::shared_ptr<CommissionerApp> &a) { a = commissionerAppMocks[camIdx++]; }),
                  Return(Error{})));
    EXPECT_CALL(*commissionerAppMocks[0], IsActive()).WillOnce(Return(false)).WillRepeatedly(Return(true));
    EXPECT_CALL(*commissionerAppMocks[1], IsActive()).WillOnce(Return(false)).WillRepeatedly(Return(true));
    EXPECT_CALL(*commissionerAppMocks[2], IsActive()).WillRepeatedly(Return(false));

    EXPECT_EQ(ctx.mJobManager.PrepareJobs({"start"}, {0x1, 0x02, 0x03}, false).mCode, ErrorCode::kNone);

    EXPECT_CALL(*commissionerAppMocks[0], Start(_, _, _)).Times(1).WillOnce(Return(Error{}));
    EXPECT_CALL(*commissionerAppMocks[1], Start(_, _, _)).Times(1).WillOnce(Return(Error{}));
    EXPECT_CALL(*commissionerAppMocks[2], Start(_, _, _))
        .Times(1)
        .WillOnce(Return(Error{ErrorCode::kAborted, "Aborted"}));

    ctx.mJobManager.RunJobs();

    Interpreter::Value value = ctx.mJobManager.CollectJobsValue();
    nlohmann::json     json  = nlohmann::json::parse(value.ToString());

    EXPECT_TRUE(json.contains("0x0000000000000001"));
    EXPECT_TRUE(json.contains("0x0000000000000002"));
    EXPECT_FALSE(json.contains("0x0000000000000003"));
    ctx.mJobManager.CleanupJobs();

    // "active" command
    EXPECT_EQ(ctx.mJobManager.PrepareJobs({"active"}, {0x1, 0x2, 0x3}, false).mCode, ErrorCode::kNone);
    ctx.mJobManager.RunJobs();
    value = ctx.mJobManager.CollectJobsValue();
    json  = nlohmann::json::parse(value.ToString());
    EXPECT_TRUE(json.contains("0x0000000000000001"));
    EXPECT_TRUE(json.contains("0x0000000000000002"));
    EXPECT_TRUE(json.contains("0x0000000000000003"));
    EXPECT_TRUE(json["0x0000000000000001"]);
    EXPECT_TRUE(json["0x0000000000000002"]);
    EXPECT_FALSE(json["0x0000000000000003"]);
    ctx.mJobManager.CleanupJobs();

    // "sessionid" command
    EXPECT_EQ(ctx.mJobManager.PrepareJobs({"sessionid"}, {0x1, 0x2}, false).mCode, ErrorCode::kNone);
    EXPECT_CALL(*commissionerAppMocks[0], GetSessionId(_))
        .WillOnce(DoAll(WithArg<0>([](uint16_t &a) { a = 0; }), Return(Error{})));
    EXPECT_CALL(*commissionerAppMocks[1], GetSessionId(_))
        .WillOnce(DoAll(WithArg<0>([](uint16_t &a) { a = 1; }), Return(Error{})));
    ctx.mJobManager.RunJobs();
    value = ctx.mJobManager.CollectJobsValue();
    json  = nlohmann::json::parse(value.ToString());
    EXPECT_TRUE(json.contains("0x0000000000000001"));
    EXPECT_TRUE(json.contains("0x0000000000000002"));
    EXPECT_EQ(json["0x0000000000000001"], 0);
    EXPECT_EQ(json["0x0000000000000002"], 1);
    ctx.mJobManager.CleanupJobs();

    // "opdataset get active" command
    EXPECT_EQ(ctx.mJobManager.PrepareJobs({"opdataset", "get", "active"}, {0x1, 0x2}, false).mCode, ErrorCode::kNone);
    EXPECT_CALL(*commissionerAppMocks[0], GetActiveDataset(_, _))
        .WillOnce(DoAll(WithArgs<0>([](ActiveOperationalDataset &ods) {
                            ods.mPanId        = 1;
                            ods.mPresentFlags = ActiveOperationalDataset::kPanIdBit;
                        }),
                        Return(Error{})));
    EXPECT_CALL(*commissionerAppMocks[1], GetActiveDataset(_, _))
        .WillOnce(DoAll(WithArgs<0>([](ActiveOperationalDataset &ods) {
                            ods.mPanId        = 2;
                            ods.mPresentFlags = ActiveOperationalDataset::kPanIdBit;
                        }),
                        Return(Error{})));
    ctx.mJobManager.RunJobs();
    value = ctx.mJobManager.CollectJobsValue();
    json  = nlohmann::json::parse(value.ToString());
    EXPECT_TRUE(json.contains("0x0000000000000001"));
    EXPECT_TRUE(json.contains("0x0000000000000002"));
    EXPECT_TRUE(json["0x0000000000000001"].contains("PanId"));
    EXPECT_TRUE(json["0x0000000000000002"].contains("PanId"));
    EXPECT_STREQ("0x0001", json["0x0000000000000001"]["PanId"].get<std::string>().c_str());
    EXPECT_STREQ("0x0002", json["0x0000000000000002"]["PanId"].get<std::string>().c_str());
    ctx.mJobManager.CleanupJobs();

    // "opdataset set securitypolicy" command
    SecurityPolicy policies[2];
    EXPECT_EQ(ctx.mJobManager.PrepareJobs({"opdataset", "set", "securitypolicy", "3", "AB"}, {0x1, 0x2}, false).mCode,
              ErrorCode::kNone);
    EXPECT_CALL(*commissionerAppMocks[0], SetSecurityPolicy(_))
        .WillOnce(DoAll(WithArgs<0>([&policies](const SecurityPolicy &pol) { policies[0] = pol; }), Return(Error{})));
    EXPECT_CALL(*commissionerAppMocks[1], SetSecurityPolicy(_))
        .WillOnce(DoAll(WithArgs<0>([&policies](const SecurityPolicy &pol) { policies[1] = pol; }), Return(Error{})));
    ctx.mJobManager.RunJobs();
    value = ctx.mJobManager.CollectJobsValue();
    json  = nlohmann::json::parse(value.ToString());
    EXPECT_TRUE(json.contains("0x0000000000000001"));
    EXPECT_TRUE(json.contains("0x0000000000000002"));
    EXPECT_TRUE(json["0x0000000000000001"]);
    EXPECT_TRUE(json["0x0000000000000002"]);
    ctx.mJobManager.CleanupJobs();

    // "stop" command
    EXPECT_EQ(ctx.mJobManager.PrepareJobs({"stop"}, {0x1, 0x2}, false).mCode, ErrorCode::kNone);
    EXPECT_CALL(*commissionerAppMocks[0], Stop());
    EXPECT_CALL(*commissionerAppMocks[1], Stop());
    ctx.mJobManager.RunJobs();
    value = ctx.mJobManager.CollectJobsValue();
    json  = nlohmann::json::parse(value.ToString());
    EXPECT_TRUE(json.contains("0x0000000000000001"));
    EXPECT_TRUE(json.contains("0x0000000000000002"));
    EXPECT_TRUE(json["0x0000000000000001"]);
    EXPECT_TRUE(json["0x0000000000000002"]);
    ctx.mJobManager.CleanupJobs();
}